

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  Primitive PVar1;
  int iVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  ulong uVar56;
  byte bVar57;
  byte bVar58;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar59;
  ulong uVar60;
  byte bVar61;
  byte bVar62;
  uint uVar63;
  ulong uVar64;
  byte bVar65;
  byte bVar66;
  long lVar67;
  undefined1 uVar68;
  bool bVar69;
  undefined1 uVar70;
  bool bVar71;
  uint uVar72;
  uint uVar137;
  uint uVar138;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar139;
  uint uVar143;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar81 [16];
  undefined1 auVar136 [64];
  float pp;
  float fVar144;
  undefined1 auVar146 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar145;
  undefined1 auVar152 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar165;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar166;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined4 uVar223;
  float fVar224;
  float fVar231;
  float fVar232;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar233;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar235;
  undefined1 auVar236 [32];
  float fVar238;
  undefined1 auVar237 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar242;
  undefined1 auVar241 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [64];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte local_1a0 [32];
  undefined1 auStack_180 [32];
  float local_160 [2];
  int local_158 [74];
  
  PVar1 = prim[1];
  uVar56 = (ulong)(byte)PVar1;
  fVar224 = *(float *)(prim + uVar56 * 0x19 + 0x12);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar79 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar81 = vsubps_avx(auVar18,*(undefined1 (*) [16])(prim + uVar56 * 0x19 + 6));
  fVar206 = fVar224 * auVar81._0_4_;
  fVar144 = fVar224 * auVar79._0_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar56 * 4 + 6);
  auVar87 = vpmovsxbd_avx2(auVar18);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar56 * 5 + 6);
  auVar86 = vpmovsxbd_avx2(auVar19);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar56 * 6 + 6);
  auVar88 = vpmovsxbd_avx2(auVar75);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar56 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar76);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar90 = vpmovsxbd_avx2(auVar73);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar56 + 6);
  auVar91 = vpmovsxbd_avx2(auVar77);
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar64 = (ulong)(uint)((int)(uVar56 * 9) * 2);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar64 + 6);
  auVar92 = vpmovsxbd_avx2(auVar80);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar64 + uVar56 + 6);
  auVar95 = vpmovsxbd_avx2(auVar74);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93 = vcvtdq2ps_avx(auVar95);
  uVar60 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar60 + 6);
  auVar84 = vpmovsxbd_avx2(auVar78);
  auVar94 = vcvtdq2ps_avx(auVar84);
  auVar102._4_4_ = fVar144;
  auVar102._0_4_ = fVar144;
  auVar102._8_4_ = fVar144;
  auVar102._12_4_ = fVar144;
  auVar102._16_4_ = fVar144;
  auVar102._20_4_ = fVar144;
  auVar102._24_4_ = fVar144;
  auVar102._28_4_ = fVar144;
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  auVar96 = ZEXT1632(CONCAT412(fVar224 * auVar79._12_4_,
                               CONCAT48(fVar224 * auVar79._8_4_,
                                        CONCAT44(fVar224 * auVar79._4_4_,fVar144))));
  auVar85 = vpermps_avx2(auVar104,auVar96);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar83 = vpermps_avx512vl(auVar82,auVar96);
  fVar144 = auVar83._0_4_;
  fVar231 = auVar83._4_4_;
  auVar96._4_4_ = fVar231 * auVar88._4_4_;
  auVar96._0_4_ = fVar144 * auVar88._0_4_;
  fVar232 = auVar83._8_4_;
  auVar96._8_4_ = fVar232 * auVar88._8_4_;
  fVar233 = auVar83._12_4_;
  auVar96._12_4_ = fVar233 * auVar88._12_4_;
  fVar238 = auVar83._16_4_;
  auVar96._16_4_ = fVar238 * auVar88._16_4_;
  fVar145 = auVar83._20_4_;
  auVar96._20_4_ = fVar145 * auVar88._20_4_;
  fVar234 = auVar83._24_4_;
  auVar96._24_4_ = fVar234 * auVar88._24_4_;
  auVar96._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar91._4_4_ * fVar231;
  auVar95._0_4_ = auVar91._0_4_ * fVar144;
  auVar95._8_4_ = auVar91._8_4_ * fVar232;
  auVar95._12_4_ = auVar91._12_4_ * fVar233;
  auVar95._16_4_ = auVar91._16_4_ * fVar238;
  auVar95._20_4_ = auVar91._20_4_ * fVar145;
  auVar95._24_4_ = auVar91._24_4_ * fVar234;
  auVar95._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar94._4_4_ * fVar231;
  auVar84._0_4_ = auVar94._0_4_ * fVar144;
  auVar84._8_4_ = auVar94._8_4_ * fVar232;
  auVar84._12_4_ = auVar94._12_4_ * fVar233;
  auVar84._16_4_ = auVar94._16_4_ * fVar238;
  auVar84._20_4_ = auVar94._20_4_ * fVar145;
  auVar84._24_4_ = auVar94._24_4_ * fVar234;
  auVar84._28_4_ = auVar83._28_4_;
  auVar18 = vfmadd231ps_fma(auVar96,auVar85,auVar86);
  auVar19 = vfmadd231ps_fma(auVar95,auVar85,auVar90);
  auVar75 = vfmadd231ps_fma(auVar84,auVar93,auVar85);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar102,auVar87);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar102,auVar89);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar92,auVar102);
  auVar103._4_4_ = fVar206;
  auVar103._0_4_ = fVar206;
  auVar103._8_4_ = fVar206;
  auVar103._12_4_ = fVar206;
  auVar103._16_4_ = fVar206;
  auVar103._20_4_ = fVar206;
  auVar103._24_4_ = fVar206;
  auVar103._28_4_ = fVar206;
  auVar84 = ZEXT1632(CONCAT412(fVar224 * auVar81._12_4_,
                               CONCAT48(fVar224 * auVar81._8_4_,
                                        CONCAT44(fVar224 * auVar81._4_4_,fVar206))));
  auVar95 = vpermps_avx2(auVar104,auVar84);
  auVar84 = vpermps_avx512vl(auVar82,auVar84);
  auVar85 = vmulps_avx512vl(auVar84,auVar88);
  auVar98._0_4_ = auVar84._0_4_ * auVar91._0_4_;
  auVar98._4_4_ = auVar84._4_4_ * auVar91._4_4_;
  auVar98._8_4_ = auVar84._8_4_ * auVar91._8_4_;
  auVar98._12_4_ = auVar84._12_4_ * auVar91._12_4_;
  auVar98._16_4_ = auVar84._16_4_ * auVar91._16_4_;
  auVar98._20_4_ = auVar84._20_4_ * auVar91._20_4_;
  auVar98._24_4_ = auVar84._24_4_ * auVar91._24_4_;
  auVar98._28_4_ = 0;
  auVar91._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar91._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar91._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar91._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar91._16_4_ = auVar84._16_4_ * auVar94._16_4_;
  auVar91._20_4_ = auVar84._20_4_ * auVar94._20_4_;
  auVar91._24_4_ = auVar84._24_4_ * auVar94._24_4_;
  auVar91._28_4_ = auVar88._28_4_;
  auVar86 = vfmadd231ps_avx512vl(auVar85,auVar95,auVar86);
  auVar76 = vfmadd231ps_fma(auVar98,auVar95,auVar90);
  auVar73 = vfmadd231ps_fma(auVar91,auVar95,auVar93);
  auVar86 = vfmadd231ps_avx512vl(auVar86,auVar103,auVar87);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar103,auVar89);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar103,auVar92);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar246 = ZEXT3264(auVar87);
  vandps_avx512vl(ZEXT1632(auVar18),auVar87);
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar100._16_4_ = 0x219392ef;
  auVar100._20_4_ = 0x219392ef;
  auVar100._24_4_ = 0x219392ef;
  auVar100._28_4_ = 0x219392ef;
  uVar64 = vcmpps_avx512vl(auVar87,auVar100,1);
  bVar71 = (bool)((byte)uVar64 & 1);
  auVar85._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar18._0_4_;
  bVar71 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar18._4_4_;
  bVar71 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar18._8_4_;
  bVar71 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar18._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar19),auVar87);
  uVar64 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar71 = (bool)((byte)uVar64 & 1);
  auVar82._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar19._0_4_;
  bVar71 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar19._4_4_;
  bVar71 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar19._8_4_;
  bVar71 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar19._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar75),auVar87);
  uVar64 = vcmpps_avx512vl(auVar82,auVar100,1);
  bVar71 = (bool)((byte)uVar64 & 1);
  auVar87._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar75._0_4_;
  bVar71 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar75._4_4_;
  bVar71 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar75._8_4_;
  bVar71 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar75._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar64 >> 7) * 0x219392ef;
  auVar88 = vrcp14ps_avx512vl(auVar85);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = &DAT_3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar85,auVar88,auVar101);
  auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar82);
  auVar19 = vfnmadd213ps_fma(auVar82,auVar88,auVar101);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar87);
  auVar75 = vfnmadd213ps_fma(auVar87,auVar88,auVar101);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar88,auVar88);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 7 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vsubps_avx512vl(auVar87,auVar86);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 9 + 6));
  auVar92._4_4_ = auVar18._4_4_ * auVar88._4_4_;
  auVar92._0_4_ = auVar18._0_4_ * auVar88._0_4_;
  auVar92._8_4_ = auVar18._8_4_ * auVar88._8_4_;
  auVar92._12_4_ = auVar18._12_4_ * auVar88._12_4_;
  auVar92._16_4_ = auVar88._16_4_ * 0.0;
  auVar92._20_4_ = auVar88._20_4_ * 0.0;
  auVar92._24_4_ = auVar88._24_4_ * 0.0;
  auVar92._28_4_ = auVar88._28_4_;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx512vl(auVar87,auVar86);
  auVar99._0_4_ = auVar18._0_4_ * auVar87._0_4_;
  auVar99._4_4_ = auVar18._4_4_ * auVar87._4_4_;
  auVar99._8_4_ = auVar18._8_4_ * auVar87._8_4_;
  auVar99._12_4_ = auVar18._12_4_ * auVar87._12_4_;
  auVar99._16_4_ = auVar87._16_4_ * 0.0;
  auVar99._20_4_ = auVar87._20_4_ * 0.0;
  auVar99._24_4_ = auVar87._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar56 * -2 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar76));
  auVar93._4_4_ = auVar19._4_4_ * auVar87._4_4_;
  auVar93._0_4_ = auVar19._0_4_ * auVar87._0_4_;
  auVar93._8_4_ = auVar19._8_4_ * auVar87._8_4_;
  auVar93._12_4_ = auVar19._12_4_ * auVar87._12_4_;
  auVar93._16_4_ = auVar87._16_4_ * 0.0;
  auVar93._20_4_ = auVar87._20_4_ * 0.0;
  auVar93._24_4_ = auVar87._24_4_ * 0.0;
  auVar93._28_4_ = auVar87._28_4_;
  auVar87 = vcvtdq2ps_avx(auVar86);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar76));
  auVar97._0_4_ = auVar19._0_4_ * auVar87._0_4_;
  auVar97._4_4_ = auVar19._4_4_ * auVar87._4_4_;
  auVar97._8_4_ = auVar19._8_4_ * auVar87._8_4_;
  auVar97._12_4_ = auVar19._12_4_ * auVar87._12_4_;
  auVar97._16_4_ = auVar87._16_4_ * 0.0;
  auVar97._20_4_ = auVar87._20_4_ * 0.0;
  auVar97._24_4_ = auVar87._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 + uVar56 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar73));
  auVar94._4_4_ = auVar87._4_4_ * auVar75._4_4_;
  auVar94._0_4_ = auVar87._0_4_ * auVar75._0_4_;
  auVar94._8_4_ = auVar87._8_4_ * auVar75._8_4_;
  auVar94._12_4_ = auVar87._12_4_ * auVar75._12_4_;
  auVar94._16_4_ = auVar87._16_4_ * 0.0;
  auVar94._20_4_ = auVar87._20_4_ * 0.0;
  auVar94._24_4_ = auVar87._24_4_ * 0.0;
  auVar94._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x17 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar73));
  auVar83._0_4_ = auVar75._0_4_ * auVar87._0_4_;
  auVar83._4_4_ = auVar75._4_4_ * auVar87._4_4_;
  auVar83._8_4_ = auVar75._8_4_ * auVar87._8_4_;
  auVar83._12_4_ = auVar75._12_4_ * auVar87._12_4_;
  auVar83._16_4_ = auVar87._16_4_ * 0.0;
  auVar83._20_4_ = auVar87._20_4_ * 0.0;
  auVar83._24_4_ = auVar87._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar87 = vpminsd_avx2(auVar92,auVar99);
  auVar86 = vpminsd_avx2(auVar93,auVar97);
  auVar87 = vmaxps_avx(auVar87,auVar86);
  auVar86 = vpminsd_avx2(auVar94,auVar83);
  uVar223 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar88._4_4_ = uVar223;
  auVar88._0_4_ = uVar223;
  auVar88._8_4_ = uVar223;
  auVar88._12_4_ = uVar223;
  auVar88._16_4_ = uVar223;
  auVar88._20_4_ = uVar223;
  auVar88._24_4_ = uVar223;
  auVar88._28_4_ = uVar223;
  auVar86 = vmaxps_avx512vl(auVar86,auVar88);
  auVar87 = vmaxps_avx(auVar87,auVar86);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  auVar86._16_4_ = 0x3f7ffffa;
  auVar86._20_4_ = 0x3f7ffffa;
  auVar86._24_4_ = 0x3f7ffffa;
  auVar86._28_4_ = 0x3f7ffffa;
  local_580 = vmulps_avx512vl(auVar87,auVar86);
  auVar87 = vpmaxsd_avx2(auVar92,auVar99);
  auVar86 = vpmaxsd_avx2(auVar93,auVar97);
  auVar87 = vminps_avx(auVar87,auVar86);
  auVar86 = vpmaxsd_avx2(auVar94,auVar83);
  uVar223 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar89._4_4_ = uVar223;
  auVar89._0_4_ = uVar223;
  auVar89._8_4_ = uVar223;
  auVar89._12_4_ = uVar223;
  auVar89._16_4_ = uVar223;
  auVar89._20_4_ = uVar223;
  auVar89._24_4_ = uVar223;
  auVar89._28_4_ = uVar223;
  auVar86 = vminps_avx512vl(auVar86,auVar89);
  auVar87 = vminps_avx(auVar87,auVar86);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar90);
  auVar86 = vpbroadcastd_avx512vl();
  uVar23 = vpcmpgtd_avx512vl(auVar86,_DAT_0205a920);
  uVar21 = vcmpps_avx512vl(local_580,auVar87,2);
  bVar69 = (byte)((byte)uVar21 & (byte)uVar23) == 0;
  bVar71 = !bVar69;
  if (bVar69) {
    return bVar71;
  }
  uVar64 = (ulong)(byte)((byte)uVar21 & (byte)uVar23);
  auVar164 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar164);
LAB_01def91a:
  lVar67 = 0;
  for (uVar56 = uVar64; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  uVar63 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar63].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar67 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar67 = *(long *)&pGVar3[1].time_range.upper;
  auVar18 = *(undefined1 (*) [16])(lVar67 + (long)p_Var4 * uVar56);
  auVar19 = *(undefined1 (*) [16])(lVar67 + (uVar56 + 1) * (long)p_Var4);
  auVar75 = *(undefined1 (*) [16])(lVar67 + (uVar56 + 2) * (long)p_Var4);
  uVar64 = uVar64 - 1 & uVar64;
  auVar76 = *(undefined1 (*) [16])(lVar67 + (uVar56 + 3) * (long)p_Var4);
  if (uVar64 != 0) {
    uVar60 = uVar64 - 1 & uVar64;
    for (uVar56 = uVar64; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    }
    if (uVar60 != 0) {
      for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar77 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar73 = vunpcklps_avx512vl(auVar88._0_16_,auVar89._0_16_);
  fVar224 = *(float *)(ray + k * 4 + 0x180);
  auVar243._4_4_ = fVar224;
  auVar243._0_4_ = fVar224;
  auVar243._8_4_ = fVar224;
  auVar243._12_4_ = fVar224;
  local_740._16_4_ = fVar224;
  local_740._0_16_ = auVar243;
  local_740._20_4_ = fVar224;
  local_740._24_4_ = fVar224;
  local_740._28_4_ = fVar224;
  local_950 = vinsertps_avx(auVar73,auVar243,0x28);
  auVar81._0_4_ = auVar18._0_4_ + auVar19._0_4_ + auVar75._0_4_ + auVar76._0_4_;
  auVar81._4_4_ = auVar18._4_4_ + auVar19._4_4_ + auVar75._4_4_ + auVar76._4_4_;
  auVar81._8_4_ = auVar18._8_4_ + auVar19._8_4_ + auVar75._8_4_ + auVar76._8_4_;
  auVar81._12_4_ = auVar18._12_4_ + auVar19._12_4_ + auVar75._12_4_ + auVar76._12_4_;
  auVar79._8_4_ = 0x3e800000;
  auVar79._0_8_ = 0x3e8000003e800000;
  auVar79._12_4_ = 0x3e800000;
  auVar73 = vmulps_avx512vl(auVar81,auVar79);
  auVar73 = vsubps_avx(auVar73,auVar77);
  auVar73 = vdpps_avx(auVar73,local_950,0x7f);
  fVar144 = *(float *)(ray + k * 4 + 0xc0);
  local_970 = vdpps_avx(local_950,local_950,0x7f);
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = local_970._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar225);
  auVar80 = vfnmadd213ss_fma(auVar74,local_970,ZEXT416(0x40000000));
  local_540 = auVar73._0_4_ * auVar74._0_4_ * auVar80._0_4_;
  auVar226._4_4_ = local_540;
  auVar226._0_4_ = local_540;
  auVar226._8_4_ = local_540;
  auVar226._12_4_ = local_540;
  fStack_710 = local_540;
  _local_720 = auVar226;
  fStack_70c = local_540;
  fStack_708 = local_540;
  fStack_704 = local_540;
  auVar73 = vfmadd231ps_fma(auVar77,local_950,auVar226);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar18 = vsubps_avx(auVar18,auVar73);
  auVar75 = vsubps_avx(auVar75,auVar73);
  auVar19 = vsubps_avx(auVar19,auVar73);
  auVar76 = vsubps_avx(auVar76,auVar73);
  uVar223 = auVar18._0_4_;
  auVar237._4_4_ = uVar223;
  auVar237._0_4_ = uVar223;
  auVar237._8_4_ = uVar223;
  auVar237._12_4_ = uVar223;
  auVar237._16_4_ = uVar223;
  auVar237._20_4_ = uVar223;
  auVar237._24_4_ = uVar223;
  auVar237._28_4_ = uVar223;
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  local_7c0 = ZEXT1632(auVar18);
  auVar87 = vpermps_avx2(auVar105,local_7c0);
  auVar106._8_4_ = 2;
  auVar106._0_8_ = 0x200000002;
  auVar106._12_4_ = 2;
  auVar106._16_4_ = 2;
  auVar106._20_4_ = 2;
  auVar106._24_4_ = 2;
  auVar106._28_4_ = 2;
  auVar86 = vpermps_avx2(auVar106,local_7c0);
  auVar107._8_4_ = 3;
  auVar107._0_8_ = 0x300000003;
  auVar107._12_4_ = 3;
  auVar107._16_4_ = 3;
  auVar107._20_4_ = 3;
  auVar107._24_4_ = 3;
  auVar107._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar107,local_7c0);
  uVar223 = auVar19._0_4_;
  local_840._4_4_ = uVar223;
  local_840._0_4_ = uVar223;
  local_840._8_4_ = uVar223;
  local_840._12_4_ = uVar223;
  local_840._16_4_ = uVar223;
  local_840._20_4_ = uVar223;
  local_840._24_4_ = uVar223;
  local_840._28_4_ = uVar223;
  local_800 = ZEXT1632(auVar19);
  local_9c0 = vpermps_avx2(auVar105,local_800);
  auVar91 = vpermps_avx512vl(auVar106,local_800);
  auVar92 = vpermps_avx512vl(auVar107,local_800);
  local_920 = vbroadcastss_avx512vl(auVar75);
  auVar244 = ZEXT3264(local_920);
  local_7e0 = ZEXT1632(auVar75);
  local_940 = vpermps_avx512vl(auVar105,local_7e0);
  auVar245 = ZEXT3264(local_940);
  auVar93 = vpermps_avx512vl(auVar106,local_7e0);
  auVar94 = vpermps_avx512vl(auVar107,local_7e0);
  local_560 = vbroadcastss_avx512vl(auVar76);
  _local_820 = ZEXT1632(auVar76);
  auVar95 = vpermps_avx512vl(auVar105,_local_820);
  auVar84 = vpermps_avx512vl(auVar106,_local_820);
  auVar85 = vpermps_avx512vl(auVar107,_local_820);
  auVar164 = ZEXT3264(local_840);
  auVar219 = ZEXT3264(local_9c0);
  auVar96 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar224 * fVar224)),auVar89,auVar89);
  local_600 = vfmadd231ps_avx512vl(auVar96,auVar88,auVar88);
  local_520._0_4_ = local_600._0_4_;
  local_520._4_4_ = local_520._0_4_;
  local_520._8_4_ = local_520._0_4_;
  local_520._12_4_ = local_520._0_4_;
  local_520._16_4_ = local_520._0_4_;
  local_520._20_4_ = local_520._0_4_;
  local_520._24_4_ = local_520._0_4_;
  local_520._28_4_ = local_520._0_4_;
  vandps_avx512vl(local_520,auVar246._0_32_);
  local_890 = ZEXT416((uint)local_540);
  local_540 = fVar144 - local_540;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  auVar246 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar246);
  iVar2 = 1;
  uVar56 = 0;
  bVar65 = 0;
  auVar246 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar246);
  auVar18 = vsqrtss_avx(local_970,local_970);
  auVar19 = vsqrtss_avx(local_970,local_970);
  local_8b0 = ZEXT816(0x3f80000000000000);
  auVar212 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar75 = vmovshdup_avx(local_8b0);
    auVar222._0_4_ = local_8b0._0_4_;
    fVar145 = auVar75._0_4_ - auVar222._0_4_;
    fVar238 = fVar145 * 0.04761905;
    auVar222._4_4_ = auVar222._0_4_;
    auVar222._8_4_ = auVar222._0_4_;
    auVar222._12_4_ = auVar222._0_4_;
    auVar222._16_4_ = auVar222._0_4_;
    auVar222._20_4_ = auVar222._0_4_;
    auVar222._24_4_ = auVar222._0_4_;
    auVar222._28_4_ = auVar222._0_4_;
    local_9a0._4_4_ = fVar145;
    local_9a0._0_4_ = fVar145;
    local_9a0._8_4_ = fVar145;
    local_9a0._12_4_ = fVar145;
    local_9a0._16_4_ = fVar145;
    local_9a0._20_4_ = fVar145;
    local_9a0._24_4_ = fVar145;
    local_9a0._28_4_ = fVar145;
    auVar75 = vfmadd231ps_fma(auVar222,local_9a0,_DAT_02020f20);
    auVar120 = auVar212._0_32_;
    auVar96 = vsubps_avx(auVar120,ZEXT1632(auVar75));
    fVar224 = auVar75._0_4_;
    auVar125._0_4_ = auVar164._0_4_ * fVar224;
    fVar231 = auVar75._4_4_;
    auVar125._4_4_ = auVar164._4_4_ * fVar231;
    fVar232 = auVar75._8_4_;
    auVar125._8_4_ = auVar164._8_4_ * fVar232;
    fVar233 = auVar75._12_4_;
    auVar125._12_4_ = auVar164._12_4_ * fVar233;
    auVar125._16_4_ = auVar164._16_4_ * 0.0;
    auVar125._20_4_ = auVar164._20_4_ * 0.0;
    auVar125._24_4_ = auVar164._24_4_ * 0.0;
    auVar125._28_4_ = 0;
    auVar97 = ZEXT1632(auVar75);
    auVar246._0_4_ = auVar219._0_4_ * fVar224;
    auVar246._4_4_ = auVar219._4_4_ * fVar231;
    auVar246._8_4_ = auVar219._8_4_ * fVar232;
    auVar246._12_4_ = auVar219._12_4_ * fVar233;
    auVar246._16_4_ = auVar219._16_4_ * 0.0;
    auVar246._20_4_ = auVar219._20_4_ * 0.0;
    auVar246._28_36_ = auVar164._28_36_;
    auVar246._24_4_ = auVar219._24_4_ * 0.0;
    auVar82 = vmulps_avx512vl(auVar91,auVar97);
    auVar83 = vmulps_avx512vl(auVar92,auVar97);
    auVar76 = vfmadd231ps_fma(auVar125,auVar96,auVar237);
    auVar73 = vfmadd231ps_fma(auVar246._0_32_,auVar96,auVar87);
    auVar77 = vfmadd231ps_fma(auVar82,auVar96,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar83,auVar96,auVar90);
    auVar83 = vmulps_avx512vl(auVar244._0_32_,auVar97);
    auVar103 = ZEXT1632(auVar75);
    auVar97 = vmulps_avx512vl(auVar245._0_32_,auVar103);
    auVar98 = vmulps_avx512vl(auVar93,auVar103);
    auVar99 = vmulps_avx512vl(auVar94,auVar103);
    auVar80 = vfmadd231ps_fma(auVar83,auVar96,auVar164._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar219._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar92);
    auVar99 = vmulps_avx512vl(local_560,auVar103);
    auVar100 = vmulps_avx512vl(auVar95,auVar103);
    auVar101 = vmulps_avx512vl(auVar84,auVar103);
    auVar102 = vmulps_avx512vl(auVar85,auVar103);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar244._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar245._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar93);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,auVar94);
    auVar103 = vmulps_avx512vl(auVar103,ZEXT1632(auVar80));
    auVar107 = ZEXT1632(auVar75);
    auVar104 = vmulps_avx512vl(auVar107,auVar83);
    auVar105 = vmulps_avx512vl(auVar107,auVar97);
    auVar106 = vmulps_avx512vl(auVar107,auVar98);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,ZEXT1632(auVar76));
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,ZEXT1632(auVar73));
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,ZEXT1632(auVar77));
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar96,auVar82);
    auVar179._0_4_ = auVar99._0_4_ * fVar224;
    auVar179._4_4_ = auVar99._4_4_ * fVar231;
    auVar179._8_4_ = auVar99._8_4_ * fVar232;
    auVar179._12_4_ = auVar99._12_4_ * fVar233;
    auVar179._16_4_ = auVar99._16_4_ * 0.0;
    auVar179._20_4_ = auVar99._20_4_ * 0.0;
    auVar179._24_4_ = auVar99._24_4_ * 0.0;
    auVar179._28_4_ = 0;
    auVar113._4_4_ = auVar100._4_4_ * fVar231;
    auVar113._0_4_ = auVar100._0_4_ * fVar224;
    auVar113._8_4_ = auVar100._8_4_ * fVar232;
    auVar113._12_4_ = auVar100._12_4_ * fVar233;
    auVar113._16_4_ = auVar100._16_4_ * 0.0;
    auVar113._20_4_ = auVar100._20_4_ * 0.0;
    auVar113._24_4_ = auVar100._24_4_ * 0.0;
    auVar113._28_4_ = auVar99._28_4_;
    auVar114._4_4_ = auVar101._4_4_ * fVar231;
    auVar114._0_4_ = auVar101._0_4_ * fVar224;
    auVar114._8_4_ = auVar101._8_4_ * fVar232;
    auVar114._12_4_ = auVar101._12_4_ * fVar233;
    auVar114._16_4_ = auVar101._16_4_ * 0.0;
    auVar114._20_4_ = auVar101._20_4_ * 0.0;
    auVar114._24_4_ = auVar101._24_4_ * 0.0;
    auVar114._28_4_ = auVar100._28_4_;
    auVar115._4_4_ = auVar102._4_4_ * fVar231;
    auVar115._0_4_ = auVar102._0_4_ * fVar224;
    auVar115._8_4_ = auVar102._8_4_ * fVar232;
    auVar115._12_4_ = auVar102._12_4_ * fVar233;
    auVar115._16_4_ = auVar102._16_4_ * 0.0;
    auVar115._20_4_ = auVar102._20_4_ * 0.0;
    auVar115._24_4_ = auVar102._24_4_ * 0.0;
    auVar115._28_4_ = auVar101._28_4_;
    auVar75 = vfmadd231ps_fma(auVar179,auVar96,ZEXT1632(auVar80));
    auVar76 = vfmadd231ps_fma(auVar113,auVar96,auVar83);
    auVar73 = vfmadd231ps_fma(auVar114,auVar96,auVar97);
    auVar77 = vfmadd231ps_fma(auVar115,auVar96,auVar98);
    auVar116._28_4_ = auVar82._28_4_;
    auVar116._0_28_ =
         ZEXT1628(CONCAT412(fVar233 * auVar75._12_4_,
                            CONCAT48(fVar232 * auVar75._8_4_,
                                     CONCAT44(fVar231 * auVar75._4_4_,fVar224 * auVar75._0_4_))));
    auVar82 = vmulps_avx512vl(auVar107,ZEXT1632(auVar76));
    auVar83 = vmulps_avx512vl(auVar107,ZEXT1632(auVar73));
    auVar97 = vfmadd231ps_avx512vl(auVar116,auVar96,auVar103);
    local_760 = vfmadd231ps_avx512vl(auVar82,auVar96,auVar104);
    local_8e0 = vfmadd231ps_avx512vl(auVar83,auVar96,auVar105);
    auVar83 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar233,
                                            CONCAT48(auVar77._8_4_ * fVar232,
                                                     CONCAT44(auVar77._4_4_ * fVar231,
                                                              auVar77._0_4_ * fVar224)))),auVar106,
                         auVar96);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar75),auVar103);
    auVar82 = vsubps_avx512vl(ZEXT1632(auVar76),auVar104);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar73),auVar105);
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar77),auVar106);
    auVar121._4_4_ = fVar238 * auVar96._4_4_ * 3.0;
    auVar121._0_4_ = fVar238 * auVar96._0_4_ * 3.0;
    auVar121._8_4_ = fVar238 * auVar96._8_4_ * 3.0;
    auVar121._12_4_ = fVar238 * auVar96._12_4_ * 3.0;
    auVar121._16_4_ = fVar238 * auVar96._16_4_ * 3.0;
    auVar121._20_4_ = fVar238 * auVar96._20_4_ * 3.0;
    auVar121._24_4_ = fVar238 * auVar96._24_4_ * 3.0;
    auVar121._28_4_ = auVar98._28_4_;
    auVar240._0_4_ = fVar238 * auVar82._0_4_ * 3.0;
    auVar240._4_4_ = fVar238 * auVar82._4_4_ * 3.0;
    auVar240._8_4_ = fVar238 * auVar82._8_4_ * 3.0;
    auVar240._12_4_ = fVar238 * auVar82._12_4_ * 3.0;
    auVar240._16_4_ = fVar238 * auVar82._16_4_ * 3.0;
    auVar240._20_4_ = fVar238 * auVar82._20_4_ * 3.0;
    auVar240._24_4_ = fVar238 * auVar82._24_4_ * 3.0;
    auVar240._28_4_ = 0;
    auVar241._0_4_ = auVar99._0_4_ * 3.0 * fVar238;
    auVar241._4_4_ = auVar99._4_4_ * 3.0 * fVar238;
    auVar241._8_4_ = auVar99._8_4_ * 3.0 * fVar238;
    auVar241._12_4_ = auVar99._12_4_ * 3.0 * fVar238;
    auVar241._16_4_ = auVar99._16_4_ * 3.0 * fVar238;
    auVar241._20_4_ = auVar99._20_4_ * 3.0 * fVar238;
    auVar241._24_4_ = auVar99._24_4_ * 3.0 * fVar238;
    auVar241._28_4_ = 0;
    fVar224 = auVar100._0_4_ * 3.0 * fVar238;
    fVar231 = auVar100._4_4_ * 3.0 * fVar238;
    auVar117._4_4_ = fVar231;
    auVar117._0_4_ = fVar224;
    fVar232 = auVar100._8_4_ * 3.0 * fVar238;
    auVar117._8_4_ = fVar232;
    fVar233 = auVar100._12_4_ * 3.0 * fVar238;
    auVar117._12_4_ = fVar233;
    fVar234 = auVar100._16_4_ * 3.0 * fVar238;
    auVar117._16_4_ = fVar234;
    fVar206 = auVar100._20_4_ * 3.0 * fVar238;
    auVar117._20_4_ = fVar206;
    fVar235 = auVar100._24_4_ * 3.0 * fVar238;
    auVar117._24_4_ = fVar235;
    auVar117._28_4_ = fVar238;
    auVar75 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar98 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,ZEXT1632(auVar75));
    auVar99 = vpermt2ps_avx512vl(local_760,_DAT_0205fd20,ZEXT1632(auVar75));
    auVar103 = ZEXT1632(auVar75);
    auVar100 = vpermt2ps_avx512vl(local_8e0,_DAT_0205fd20,auVar103);
    auVar180._0_4_ = auVar83._0_4_ + fVar224;
    auVar180._4_4_ = auVar83._4_4_ + fVar231;
    auVar180._8_4_ = auVar83._8_4_ + fVar232;
    auVar180._12_4_ = auVar83._12_4_ + fVar233;
    auVar180._16_4_ = auVar83._16_4_ + fVar234;
    auVar180._20_4_ = auVar83._20_4_ + fVar206;
    auVar180._24_4_ = auVar83._24_4_ + fVar235;
    auVar180._28_4_ = auVar83._28_4_ + fVar238;
    auVar96 = vmaxps_avx(auVar83,auVar180);
    auVar82 = vminps_avx(auVar83,auVar180);
    auVar101 = vpermt2ps_avx512vl(auVar83,_DAT_0205fd20,auVar103);
    auVar102 = vpermt2ps_avx512vl(auVar121,_DAT_0205fd20,auVar103);
    auVar103 = vpermt2ps_avx512vl(auVar240,_DAT_0205fd20,auVar103);
    auVar125 = ZEXT1632(auVar75);
    auVar104 = vpermt2ps_avx512vl(auVar241,_DAT_0205fd20,auVar125);
    auVar83 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,auVar125);
    auVar105 = vsubps_avx512vl(auVar101,auVar83);
    auVar83 = vsubps_avx(auVar98,auVar97);
    auVar106 = vsubps_avx512vl(auVar99,local_760);
    auVar107 = vsubps_avx512vl(auVar100,local_8e0);
    auVar108 = vmulps_avx512vl(auVar106,auVar241);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar240,auVar107);
    auVar109 = vmulps_avx512vl(auVar107,auVar121);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar241,auVar83);
    auVar110 = vmulps_avx512vl(auVar83,auVar240);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar121,auVar106);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar106);
    auVar111 = vfmadd231ps_avx512vl(auVar109,auVar83,auVar83);
    auVar109 = vrcp14ps_avx512vl(auVar111);
    auVar110 = vfnmadd213ps_avx512vl(auVar109,auVar111,auVar120);
    auVar109 = vfmadd132ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vmulps_avx512vl(auVar108,auVar109);
    auVar110 = vmulps_avx512vl(auVar106,auVar104);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar103,auVar107);
    auVar112 = vmulps_avx512vl(auVar107,auVar102);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar104,auVar83);
    auVar113 = vmulps_avx512vl(auVar83,auVar103);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar102,auVar106);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar110 = vfmadd231ps_avx512vl(auVar112,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar110,auVar109);
    auVar108 = vmaxps_avx512vl(auVar108,auVar109);
    auVar108 = vsqrtps_avx512vl(auVar108);
    auVar109 = vmaxps_avx512vl(auVar105,auVar101);
    auVar96 = vmaxps_avx512vl(auVar96,auVar109);
    auVar109 = vaddps_avx512vl(auVar108,auVar96);
    auVar96 = vminps_avx512vl(auVar105,auVar101);
    auVar96 = vminps_avx(auVar82,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar108);
    auVar108._8_4_ = 0x3f800002;
    auVar108._0_8_ = 0x3f8000023f800002;
    auVar108._12_4_ = 0x3f800002;
    auVar108._16_4_ = 0x3f800002;
    auVar108._20_4_ = 0x3f800002;
    auVar108._24_4_ = 0x3f800002;
    auVar108._28_4_ = 0x3f800002;
    auVar82 = vmulps_avx512vl(auVar109,auVar108);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    auVar96 = vmulps_avx512vl(auVar96,auVar109);
    auVar118._4_4_ = auVar82._4_4_ * auVar82._4_4_;
    auVar118._0_4_ = auVar82._0_4_ * auVar82._0_4_;
    auVar118._8_4_ = auVar82._8_4_ * auVar82._8_4_;
    auVar118._12_4_ = auVar82._12_4_ * auVar82._12_4_;
    auVar118._16_4_ = auVar82._16_4_ * auVar82._16_4_;
    auVar118._20_4_ = auVar82._20_4_ * auVar82._20_4_;
    auVar118._24_4_ = auVar82._24_4_ * auVar82._24_4_;
    auVar118._28_4_ = auVar96._28_4_;
    auVar82 = vrsqrt14ps_avx512vl(auVar111);
    auVar110._8_4_ = 0xbf000000;
    auVar110._0_8_ = 0xbf000000bf000000;
    auVar110._12_4_ = 0xbf000000;
    auVar110._16_4_ = 0xbf000000;
    auVar110._20_4_ = 0xbf000000;
    auVar110._24_4_ = 0xbf000000;
    auVar110._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar111,auVar110);
    auVar122._4_4_ = auVar82._4_4_ * auVar101._4_4_;
    auVar122._0_4_ = auVar82._0_4_ * auVar101._0_4_;
    auVar122._8_4_ = auVar82._8_4_ * auVar101._8_4_;
    auVar122._12_4_ = auVar82._12_4_ * auVar101._12_4_;
    auVar122._16_4_ = auVar82._16_4_ * auVar101._16_4_;
    auVar122._20_4_ = auVar82._20_4_ * auVar101._20_4_;
    auVar122._24_4_ = auVar82._24_4_ * auVar101._24_4_;
    auVar122._28_4_ = auVar101._28_4_;
    auVar101 = vmulps_avx512vl(auVar82,auVar82);
    auVar101 = vmulps_avx512vl(auVar101,auVar122);
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar82,auVar111);
    auVar124._4_4_ = auVar101._4_4_ * auVar83._4_4_;
    auVar124._0_4_ = auVar101._0_4_ * auVar83._0_4_;
    auVar124._8_4_ = auVar101._8_4_ * auVar83._8_4_;
    auVar124._12_4_ = auVar101._12_4_ * auVar83._12_4_;
    auVar124._16_4_ = auVar101._16_4_ * auVar83._16_4_;
    auVar124._20_4_ = auVar101._20_4_ * auVar83._20_4_;
    auVar124._24_4_ = auVar101._24_4_ * auVar83._24_4_;
    auVar124._28_4_ = auVar82._28_4_;
    auVar82 = vmulps_avx512vl(auVar106,auVar101);
    auVar105 = vmulps_avx512vl(auVar107,auVar101);
    auVar108 = vsubps_avx512vl(auVar125,auVar97);
    auVar109 = vsubps_avx512vl(auVar125,local_760);
    auVar110 = vsubps_avx512vl(auVar125,local_8e0);
    auVar111 = vmulps_avx512vl(local_740,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar89,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar88,auVar108);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar113 = vmulps_avx512vl(local_740,auVar105);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar82,auVar89);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar124,auVar88);
    auVar105 = vmulps_avx512vl(auVar110,auVar105);
    auVar82 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar82);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar108,auVar124);
    local_900 = vmulps_avx512vl(auVar113,auVar113);
    auVar105 = vsubps_avx512vl(local_520,local_900);
    auVar114 = vmulps_avx512vl(auVar113,auVar82);
    auVar111 = vsubps_avx512vl(auVar111,auVar114);
    auVar111 = vaddps_avx512vl(auVar111,auVar111);
    auVar114 = vmulps_avx512vl(auVar82,auVar82);
    local_780 = vsubps_avx512vl(auVar112,auVar114);
    auVar114 = vsubps_avx512vl(local_780,auVar118);
    auVar115 = vmulps_avx512vl(auVar111,auVar111);
    auVar112._8_4_ = 0x40800000;
    auVar112._0_8_ = 0x4080000040800000;
    auVar112._12_4_ = 0x40800000;
    auVar112._16_4_ = 0x40800000;
    auVar112._20_4_ = 0x40800000;
    auVar112._24_4_ = 0x40800000;
    auVar112._28_4_ = 0x40800000;
    auVar112 = vmulps_avx512vl(auVar105,auVar112);
    auVar116 = vmulps_avx512vl(auVar112,auVar114);
    auVar116 = vsubps_avx512vl(auVar115,auVar116);
    uVar60 = vcmpps_avx512vl(auVar116,auVar125,5);
    bVar58 = (byte)uVar60;
    if (bVar58 == 0) {
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      in_ZMM31 = ZEXT3264(auVar114);
    }
    else {
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar117 = vaddps_avx512vl(auVar105,auVar105);
      auVar118 = vrcp14ps_avx512vl(auVar117);
      auVar117 = vfnmadd213ps_avx512vl(auVar117,auVar118,auVar120);
      auVar117 = vfmadd132ps_avx512vl(auVar117,auVar118,auVar118);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar118 = vxorps_avx512vl(auVar111,auVar31);
      auVar118 = vsubps_avx512vl(auVar118,auVar116);
      auVar118 = vmulps_avx512vl(auVar118,auVar117);
      auVar116 = vsubps_avx512vl(auVar116,auVar111);
      auVar116 = vmulps_avx512vl(auVar116,auVar117);
      auVar117 = vfmadd213ps_avx512vl(auVar113,auVar118,auVar82);
      local_640 = vmulps_avx512vl(auVar101,auVar117);
      auVar117 = vfmadd213ps_avx512vl(auVar113,auVar116,auVar82);
      local_660 = vmulps_avx512vl(auVar101,auVar117);
      auVar153._8_4_ = 0x7f800000;
      auVar153._0_8_ = 0x7f8000007f800000;
      auVar153._12_4_ = 0x7f800000;
      auVar153._16_4_ = 0x7f800000;
      auVar153._20_4_ = 0x7f800000;
      auVar153._24_4_ = 0x7f800000;
      auVar153._28_4_ = 0x7f800000;
      auVar117 = vblendmps_avx512vl(auVar153,auVar118);
      auVar120._0_4_ =
           (uint)(bVar58 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar58 & 1) * local_660._0_4_;
      bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar69 * auVar117._4_4_ | (uint)!bVar69 * local_660._4_4_;
      bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar69 * auVar117._8_4_ | (uint)!bVar69 * local_660._8_4_;
      bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar69 * auVar117._12_4_ | (uint)!bVar69 * local_660._12_4_;
      bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar69 * auVar117._16_4_ | (uint)!bVar69 * local_660._16_4_;
      bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar69 * auVar117._20_4_ | (uint)!bVar69 * local_660._20_4_;
      bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar69 * auVar117._24_4_ | (uint)!bVar69 * local_660._24_4_;
      bVar69 = SUB81(uVar60 >> 7,0);
      auVar120._28_4_ = (uint)bVar69 * auVar117._28_4_ | (uint)!bVar69 * local_660._28_4_;
      auVar154._8_4_ = 0xff800000;
      auVar154._0_8_ = 0xff800000ff800000;
      auVar154._12_4_ = 0xff800000;
      auVar154._16_4_ = 0xff800000;
      auVar154._20_4_ = 0xff800000;
      auVar154._24_4_ = 0xff800000;
      auVar154._28_4_ = 0xff800000;
      auVar117 = vblendmps_avx512vl(auVar154,auVar116);
      auVar119._0_4_ =
           (uint)(bVar58 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar116._0_4_;
      bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar69 * auVar117._4_4_ | (uint)!bVar69 * auVar116._4_4_;
      bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar69 * auVar117._8_4_ | (uint)!bVar69 * auVar116._8_4_;
      bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar69 * auVar117._12_4_ | (uint)!bVar69 * auVar116._12_4_;
      bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar69 * auVar117._16_4_ | (uint)!bVar69 * auVar116._16_4_;
      bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar69 * auVar117._20_4_ | (uint)!bVar69 * auVar116._20_4_;
      bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar69 * auVar117._24_4_ | (uint)!bVar69 * auVar116._24_4_;
      bVar69 = SUB81(uVar60 >> 7,0);
      auVar119._28_4_ = (uint)bVar69 * auVar117._28_4_ | (uint)!bVar69 * auVar116._28_4_;
      in_ZMM31 = ZEXT3264(auVar119);
      auVar155._8_4_ = 0x7fffffff;
      auVar155._0_8_ = 0x7fffffff7fffffff;
      auVar155._12_4_ = 0x7fffffff;
      auVar155._16_4_ = 0x7fffffff;
      auVar155._20_4_ = 0x7fffffff;
      auVar155._24_4_ = 0x7fffffff;
      auVar155._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_900,auVar155);
      auVar116 = vmaxps_avx512vl(local_600,auVar119);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      auVar117 = vmulps_avx512vl(auVar116,auVar32);
      auVar116 = vandps_avx(auVar105,auVar155);
      uVar59 = vcmpps_avx512vl(auVar116,auVar117,1);
      uVar60 = uVar60 & uVar59;
      bVar62 = (byte)uVar60;
      if (bVar62 != 0) {
        uVar59 = vcmpps_avx512vl(auVar114,_DAT_02020f00,2);
        auVar181._8_4_ = 0xff800000;
        auVar181._0_8_ = 0xff800000ff800000;
        auVar181._12_4_ = 0xff800000;
        auVar181._16_4_ = 0xff800000;
        auVar181._20_4_ = 0xff800000;
        auVar181._24_4_ = 0xff800000;
        auVar181._28_4_ = 0xff800000;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar117 = vblendmps_avx512vl(auVar114,auVar181);
        bVar57 = (byte)uVar59;
        uVar72 = (uint)(bVar57 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar116._0_4_;
        bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
        uVar137 = (uint)bVar69 * auVar117._4_4_ | (uint)!bVar69 * auVar116._4_4_;
        bVar69 = (bool)((byte)(uVar59 >> 2) & 1);
        uVar138 = (uint)bVar69 * auVar117._8_4_ | (uint)!bVar69 * auVar116._8_4_;
        bVar69 = (bool)((byte)(uVar59 >> 3) & 1);
        uVar139 = (uint)bVar69 * auVar117._12_4_ | (uint)!bVar69 * auVar116._12_4_;
        bVar69 = (bool)((byte)(uVar59 >> 4) & 1);
        uVar140 = (uint)bVar69 * auVar117._16_4_ | (uint)!bVar69 * auVar116._16_4_;
        bVar69 = (bool)((byte)(uVar59 >> 5) & 1);
        uVar141 = (uint)bVar69 * auVar117._20_4_ | (uint)!bVar69 * auVar116._20_4_;
        bVar69 = (bool)((byte)(uVar59 >> 6) & 1);
        uVar142 = (uint)bVar69 * auVar117._24_4_ | (uint)!bVar69 * auVar116._24_4_;
        bVar69 = SUB81(uVar59 >> 7,0);
        uVar143 = (uint)bVar69 * auVar117._28_4_ | (uint)!bVar69 * auVar116._28_4_;
        auVar120._0_4_ = (bVar62 & 1) * uVar72 | !(bool)(bVar62 & 1) * auVar120._0_4_;
        bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar120._4_4_ = bVar69 * uVar137 | !bVar69 * auVar120._4_4_;
        bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar120._8_4_ = bVar69 * uVar138 | !bVar69 * auVar120._8_4_;
        bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar120._12_4_ = bVar69 * uVar139 | !bVar69 * auVar120._12_4_;
        bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar120._16_4_ = bVar69 * uVar140 | !bVar69 * auVar120._16_4_;
        bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar120._20_4_ = bVar69 * uVar141 | !bVar69 * auVar120._20_4_;
        bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar120._24_4_ = bVar69 * uVar142 | !bVar69 * auVar120._24_4_;
        bVar69 = SUB81(uVar60 >> 7,0);
        auVar120._28_4_ = bVar69 * uVar143 | !bVar69 * auVar120._28_4_;
        auVar114 = vblendmps_avx512vl(auVar181,auVar114);
        bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar59 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar59 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar59 >> 6) & 1);
        bVar16 = SUB81(uVar59 >> 7,0);
        bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar17 = SUB81(uVar60 >> 7,0);
        in_ZMM31 = ZEXT3264(CONCAT428((uint)bVar17 *
                                      ((uint)bVar16 * auVar114._28_4_ | !bVar16 * uVar143) |
                                      !bVar17 * auVar119._28_4_,
                                      CONCAT424((uint)bVar15 *
                                                ((uint)bVar14 * auVar114._24_4_ | !bVar14 * uVar142)
                                                | !bVar15 * auVar119._24_4_,
                                                CONCAT420((uint)bVar13 *
                                                          ((uint)bVar12 * auVar114._20_4_ |
                                                          !bVar12 * uVar141) |
                                                          !bVar13 * auVar119._20_4_,
                                                          CONCAT416((uint)bVar11 *
                                                                    ((uint)bVar10 * auVar114._16_4_
                                                                    | !bVar10 * uVar140) |
                                                                    !bVar11 * auVar119._16_4_,
                                                                    CONCAT412((uint)bVar9 *
                                                                              ((uint)bVar8 *
                                                                               auVar114._12_4_ |
                                                                              !bVar8 * uVar139) |
                                                                              !bVar9 * auVar119.
                                                  _12_4_,CONCAT48((uint)bVar7 *
                                                                  ((uint)bVar6 * auVar114._8_4_ |
                                                                  !bVar6 * uVar138) |
                                                                  !bVar7 * auVar119._8_4_,
                                                                  CONCAT44((uint)bVar5 *
                                                                           ((uint)bVar69 *
                                                                            auVar114._4_4_ |
                                                                           !bVar69 * uVar137) |
                                                                           !bVar5 * auVar119._4_4_,
                                                                           (uint)(bVar62 & 1) *
                                                                           ((uint)(bVar57 & 1) *
                                                                            auVar114._0_4_ |
                                                                           !(bool)(bVar57 & 1) *
                                                                           uVar72) | !(bool)(bVar62 
                                                  & 1) * auVar119._0_4_))))))));
        bVar58 = (~bVar62 | bVar57) & bVar58;
      }
    }
    if ((bVar58 & 0x7f) == 0) {
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar246 = ZEXT3264(auVar96);
      auVar123._8_4_ = 0x3f800000;
      auVar123._0_8_ = &DAT_3f8000003f800000;
      auVar123._12_4_ = 0x3f800000;
      auVar123._16_4_ = 0x3f800000;
      auVar123._20_4_ = 0x3f800000;
      auVar123._24_4_ = 0x3f800000;
      auVar123._28_4_ = 0x3f800000;
LAB_01df0651:
      auVar212 = ZEXT3264(auVar123);
      auVar164 = ZEXT3264(local_840);
      auVar219 = ZEXT3264(local_9c0);
      auVar244 = ZEXT3264(local_920);
      auVar245 = ZEXT3264(local_940);
    }
    else {
      fVar224 = *(float *)(ray + k * 4 + 0x200) - (float)local_890._0_4_;
      auVar156._4_4_ = fVar224;
      auVar156._0_4_ = fVar224;
      auVar156._8_4_ = fVar224;
      auVar156._12_4_ = fVar224;
      auVar156._16_4_ = fVar224;
      auVar156._20_4_ = fVar224;
      auVar156._24_4_ = fVar224;
      auVar156._28_4_ = fVar224;
      auVar114 = vminps_avx512vl(auVar156,in_ZMM31._0_32_);
      auVar54._4_4_ = fStack_53c;
      auVar54._0_4_ = local_540;
      auVar54._8_4_ = fStack_538;
      auVar54._12_4_ = fStack_534;
      auVar54._16_4_ = fStack_530;
      auVar54._20_4_ = fStack_52c;
      auVar54._24_4_ = fStack_528;
      auVar54._28_4_ = fStack_524;
      auVar116 = vmaxps_avx512vl(auVar54,auVar120);
      auVar110 = vmulps_avx512vl(auVar110,auVar241);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar240,auVar110);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar121,auVar109);
      auVar109 = vmulps_avx512vl(local_740,auVar241);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar89,auVar240);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar88,auVar121);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar246 = ZEXT3264(auVar110);
      vandps_avx512vl(auVar109,auVar110);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar110,auVar121,1);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar117);
      auVar108 = vxorps_avx512vl(auVar108,auVar117);
      auVar118 = vrcp14ps_avx512vl(auVar109);
      auVar122 = vxorps_avx512vl(auVar109,auVar117);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar124 = vfnmadd213ps_avx512vl(auVar118,auVar109,auVar123);
      auVar124 = vfmadd132ps_avx512vl(auVar124,auVar118,auVar118);
      auVar124 = vmulps_avx512vl(auVar124,auVar108);
      uVar23 = vcmpps_avx512vl(auVar109,auVar122,1);
      bVar62 = (byte)uVar21 | (byte)uVar23;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar108 = vblendmps_avx512vl(auVar124,auVar125);
      auVar126._0_4_ =
           (uint)(bVar62 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar118._0_4_;
      bVar69 = (bool)(bVar62 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar69 * auVar108._4_4_ | (uint)!bVar69 * auVar118._4_4_;
      bVar69 = (bool)(bVar62 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar69 * auVar108._8_4_ | (uint)!bVar69 * auVar118._8_4_;
      bVar69 = (bool)(bVar62 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar69 * auVar108._12_4_ | (uint)!bVar69 * auVar118._12_4_;
      bVar69 = (bool)(bVar62 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar69 * auVar108._16_4_ | (uint)!bVar69 * auVar118._16_4_;
      bVar69 = (bool)(bVar62 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar69 * auVar108._20_4_ | (uint)!bVar69 * auVar118._20_4_;
      bVar69 = (bool)(bVar62 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar69 * auVar108._24_4_ | (uint)!bVar69 * auVar118._24_4_;
      auVar126._28_4_ =
           (uint)(bVar62 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar118._28_4_;
      auVar108 = vmaxps_avx(auVar116,auVar126);
      uVar23 = vcmpps_avx512vl(auVar109,auVar122,6);
      bVar62 = (byte)uVar21 | (byte)uVar23;
      auVar127._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * auVar124._0_4_;
      bVar69 = (bool)(bVar62 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar124._4_4_;
      bVar69 = (bool)(bVar62 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar124._8_4_;
      bVar69 = (bool)(bVar62 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar124._12_4_;
      bVar69 = (bool)(bVar62 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar124._16_4_;
      bVar69 = (bool)(bVar62 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar124._20_4_;
      bVar69 = (bool)(bVar62 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * auVar124._24_4_;
      auVar127._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar124._28_4_;
      auVar109 = vminps_avx(auVar114,auVar127);
      auVar76 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar76),auVar98);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar76),auVar99);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar76),auVar100);
      auVar42._4_4_ = auVar100._4_4_ * auVar104._4_4_;
      auVar42._0_4_ = auVar100._0_4_ * auVar104._0_4_;
      auVar42._8_4_ = auVar100._8_4_ * auVar104._8_4_;
      auVar42._12_4_ = auVar100._12_4_ * auVar104._12_4_;
      auVar42._16_4_ = auVar100._16_4_ * auVar104._16_4_;
      auVar42._20_4_ = auVar100._20_4_ * auVar104._20_4_;
      auVar42._24_4_ = auVar100._24_4_ * auVar104._24_4_;
      auVar42._28_4_ = auVar100._28_4_;
      auVar99 = vfnmsub231ps_avx512vl(auVar42,auVar103,auVar99);
      auVar98 = vfnmadd231ps_avx512vl(auVar99,auVar102,auVar98);
      auVar99 = vmulps_avx512vl(local_740,auVar104);
      auVar99 = vfnmsub231ps_avx512vl(auVar99,auVar89,auVar103);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar88,auVar102);
      vandps_avx512vl(auVar99,auVar110);
      uVar21 = vcmpps_avx512vl(auVar99,auVar121,1);
      auVar98 = vxorps_avx512vl(auVar98,auVar117);
      auVar100 = vrcp14ps_avx512vl(auVar99);
      auVar102 = vxorps_avx512vl(auVar99,auVar117);
      auVar104 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar123);
      auVar75 = vfmadd132ps_fma(auVar104,auVar100,auVar100);
      fVar224 = auVar75._0_4_ * auVar98._0_4_;
      fVar231 = auVar75._4_4_ * auVar98._4_4_;
      auVar43._4_4_ = fVar231;
      auVar43._0_4_ = fVar224;
      fVar232 = auVar75._8_4_ * auVar98._8_4_;
      auVar43._8_4_ = fVar232;
      fVar233 = auVar75._12_4_ * auVar98._12_4_;
      auVar43._12_4_ = fVar233;
      fVar238 = auVar98._16_4_ * 0.0;
      auVar43._16_4_ = fVar238;
      fVar234 = auVar98._20_4_ * 0.0;
      auVar43._20_4_ = fVar234;
      fVar206 = auVar98._24_4_ * 0.0;
      auVar43._24_4_ = fVar206;
      auVar43._28_4_ = auVar98._28_4_;
      uVar23 = vcmpps_avx512vl(auVar99,auVar102,1);
      bVar62 = (byte)uVar21 | (byte)uVar23;
      auVar104 = vblendmps_avx512vl(auVar43,auVar125);
      auVar128._0_4_ =
           (uint)(bVar62 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar100._0_4_;
      bVar69 = (bool)(bVar62 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar69 * auVar104._4_4_ | (uint)!bVar69 * auVar100._4_4_;
      bVar69 = (bool)(bVar62 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar69 * auVar104._8_4_ | (uint)!bVar69 * auVar100._8_4_;
      bVar69 = (bool)(bVar62 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar69 * auVar104._12_4_ | (uint)!bVar69 * auVar100._12_4_;
      bVar69 = (bool)(bVar62 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar69 * auVar104._16_4_ | (uint)!bVar69 * auVar100._16_4_;
      bVar69 = (bool)(bVar62 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar69 * auVar104._20_4_ | (uint)!bVar69 * auVar100._20_4_;
      bVar69 = (bool)(bVar62 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar69 * auVar104._24_4_ | (uint)!bVar69 * auVar100._24_4_;
      auVar128._28_4_ =
           (uint)(bVar62 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar100._28_4_;
      _local_7a0 = vmaxps_avx(auVar108,auVar128);
      uVar23 = vcmpps_avx512vl(auVar99,auVar102,6);
      bVar62 = (byte)uVar21 | (byte)uVar23;
      auVar129._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar224;
      bVar69 = (bool)(bVar62 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar231;
      bVar69 = (bool)(bVar62 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar232;
      bVar69 = (bool)(bVar62 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar233;
      bVar69 = (bool)(bVar62 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar238;
      bVar69 = (bool)(bVar62 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar234;
      bVar69 = (bool)(bVar62 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar206;
      auVar129._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar98._28_4_;
      local_5c0 = vminps_avx(auVar109,auVar129);
      uVar21 = vcmpps_avx512vl(_local_7a0,local_5c0,2);
      bVar58 = bVar58 & 0x7f & (byte)uVar21;
      if (bVar58 == 0) goto LAB_01df0651;
      auVar98 = vmaxps_avx512vl(ZEXT1632(auVar76),auVar96);
      auVar96 = vminps_avx512vl(local_640,auVar123);
      auVar49 = ZEXT412(0);
      auVar99 = ZEXT1232(auVar49) << 0x20;
      auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar49) << 0x20);
      auVar100 = vminps_avx512vl(local_660,auVar123);
      auVar44._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar96._28_4_ + 7.0;
      auVar75 = vfmadd213ps_fma(auVar44,local_9a0,auVar222);
      local_640 = ZEXT1632(auVar75);
      auVar96 = vmaxps_avx(auVar100,ZEXT1232(auVar49) << 0x20);
      auVar45._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar96._28_4_ + 7.0;
      auVar75 = vfmadd213ps_fma(auVar45,local_9a0,auVar222);
      local_660 = ZEXT1632(auVar75);
      auVar157._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar157._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar157._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar157._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar157._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar157._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar157._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar157._28_4_ = 0;
      auVar96 = vsubps_avx(local_780,auVar157);
      auVar98 = vmulps_avx512vl(auVar112,auVar96);
      auVar98 = vsubps_avx(auVar115,auVar98);
      uVar21 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar49) << 0x20,5);
      bVar62 = (byte)uVar21;
      if (bVar62 == 0) {
        auVar82 = ZEXT832(0) << 0x20;
        auVar83 = ZEXT832(0) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar98 = ZEXT832(0) << 0x20;
        auVar130._8_4_ = 0x7f800000;
        auVar130._0_8_ = 0x7f8000007f800000;
        auVar130._12_4_ = 0x7f800000;
        auVar130._16_4_ = 0x7f800000;
        auVar130._20_4_ = 0x7f800000;
        auVar130._24_4_ = 0x7f800000;
        auVar130._28_4_ = 0x7f800000;
        auVar131._8_4_ = 0xff800000;
        auVar131._0_8_ = 0xff800000ff800000;
        auVar131._12_4_ = 0xff800000;
        auVar131._16_4_ = 0xff800000;
        auVar131._20_4_ = 0xff800000;
        auVar131._24_4_ = 0xff800000;
        auVar131._28_4_ = 0xff800000;
      }
      else {
        auVar73 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
        uVar60 = vcmpps_avx512vl(auVar98,ZEXT1632(auVar76),5);
        auVar98 = vsqrtps_avx(auVar98);
        auVar182._0_4_ = auVar105._0_4_ + auVar105._0_4_;
        auVar182._4_4_ = auVar105._4_4_ + auVar105._4_4_;
        auVar182._8_4_ = auVar105._8_4_ + auVar105._8_4_;
        auVar182._12_4_ = auVar105._12_4_ + auVar105._12_4_;
        auVar182._16_4_ = auVar105._16_4_ + auVar105._16_4_;
        auVar182._20_4_ = auVar105._20_4_ + auVar105._20_4_;
        auVar182._24_4_ = auVar105._24_4_ + auVar105._24_4_;
        auVar182._28_4_ = auVar105._28_4_ + auVar105._28_4_;
        auVar99 = vrcp14ps_avx512vl(auVar182);
        auVar100 = vfnmadd213ps_avx512vl(auVar182,auVar99,auVar123);
        auVar75 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
        auVar33._8_4_ = 0x80000000;
        auVar33._0_8_ = 0x8000000080000000;
        auVar33._12_4_ = 0x80000000;
        auVar33._16_4_ = 0x80000000;
        auVar33._20_4_ = 0x80000000;
        auVar33._24_4_ = 0x80000000;
        auVar33._28_4_ = 0x80000000;
        auVar99 = vxorps_avx512vl(auVar111,auVar33);
        auVar99 = vsubps_avx(auVar99,auVar98);
        auVar46._4_4_ = auVar99._4_4_ * auVar75._4_4_;
        auVar46._0_4_ = auVar99._0_4_ * auVar75._0_4_;
        auVar46._8_4_ = auVar99._8_4_ * auVar75._8_4_;
        auVar46._12_4_ = auVar99._12_4_ * auVar75._12_4_;
        auVar46._16_4_ = auVar99._16_4_ * 0.0;
        auVar46._20_4_ = auVar99._20_4_ * 0.0;
        auVar46._24_4_ = auVar99._24_4_ * 0.0;
        auVar46._28_4_ = 0x3e000000;
        auVar98 = vsubps_avx512vl(auVar98,auVar111);
        auVar47._4_4_ = auVar98._4_4_ * auVar75._4_4_;
        auVar47._0_4_ = auVar98._0_4_ * auVar75._0_4_;
        auVar47._8_4_ = auVar98._8_4_ * auVar75._8_4_;
        auVar47._12_4_ = auVar98._12_4_ * auVar75._12_4_;
        auVar47._16_4_ = auVar98._16_4_ * 0.0;
        auVar47._20_4_ = auVar98._20_4_ * 0.0;
        auVar47._24_4_ = auVar98._24_4_ * 0.0;
        auVar47._28_4_ = fVar145;
        auVar98 = vfmadd213ps_avx512vl(auVar113,auVar46,auVar82);
        auVar48._4_4_ = auVar101._4_4_ * auVar98._4_4_;
        auVar48._0_4_ = auVar101._0_4_ * auVar98._0_4_;
        auVar48._8_4_ = auVar101._8_4_ * auVar98._8_4_;
        auVar48._12_4_ = auVar101._12_4_ * auVar98._12_4_;
        auVar48._16_4_ = auVar101._16_4_ * auVar98._16_4_;
        auVar48._20_4_ = auVar101._20_4_ * auVar98._20_4_;
        auVar48._24_4_ = auVar101._24_4_ * auVar98._24_4_;
        auVar48._28_4_ = auVar99._28_4_;
        auVar98 = vmulps_avx512vl(auVar88,auVar46);
        auVar99 = vmulps_avx512vl(auVar89,auVar46);
        auVar103 = vmulps_avx512vl(local_740,auVar46);
        auVar100 = vfmadd213ps_avx512vl(auVar83,auVar48,auVar97);
        auVar100 = vsubps_avx512vl(auVar98,auVar100);
        auVar98 = vfmadd213ps_avx512vl(auVar106,auVar48,local_760);
        auVar102 = vsubps_avx512vl(auVar99,auVar98);
        auVar75 = vfmadd213ps_fma(auVar48,auVar107,local_8e0);
        auVar98 = vsubps_avx(auVar103,ZEXT1632(auVar75));
        auVar82 = vfmadd213ps_avx512vl(auVar113,auVar47,auVar82);
        auVar101 = vmulps_avx512vl(auVar101,auVar82);
        auVar82 = vmulps_avx512vl(auVar88,auVar47);
        auVar103 = vmulps_avx512vl(auVar89,auVar47);
        auVar104 = vmulps_avx512vl(local_740,auVar47);
        auVar75 = vfmadd213ps_fma(auVar83,auVar101,auVar97);
        auVar99 = vsubps_avx(auVar82,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar106,auVar101,local_760);
        auVar82 = vsubps_avx512vl(auVar103,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar107,auVar101,local_8e0);
        auVar83 = vsubps_avx512vl(auVar104,ZEXT1632(auVar75));
        auVar202._8_4_ = 0x7f800000;
        auVar202._0_8_ = 0x7f8000007f800000;
        auVar202._12_4_ = 0x7f800000;
        auVar202._16_4_ = 0x7f800000;
        auVar202._20_4_ = 0x7f800000;
        auVar202._24_4_ = 0x7f800000;
        auVar202._28_4_ = 0x7f800000;
        auVar101 = vblendmps_avx512vl(auVar202,auVar46);
        bVar69 = (bool)((byte)uVar60 & 1);
        auVar130._0_4_ = (uint)bVar69 * auVar101._0_4_ | (uint)!bVar69 * auVar97._0_4_;
        bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar69 * auVar101._4_4_ | (uint)!bVar69 * auVar97._4_4_;
        bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar69 * auVar101._8_4_ | (uint)!bVar69 * auVar97._8_4_;
        bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar69 * auVar101._12_4_ | (uint)!bVar69 * auVar97._12_4_;
        bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar69 * auVar101._16_4_ | (uint)!bVar69 * auVar97._16_4_;
        bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar69 * auVar101._20_4_ | (uint)!bVar69 * auVar97._20_4_;
        bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar69 * auVar101._24_4_ | (uint)!bVar69 * auVar97._24_4_;
        bVar69 = SUB81(uVar60 >> 7,0);
        auVar130._28_4_ = (uint)bVar69 * auVar101._28_4_ | (uint)!bVar69 * auVar97._28_4_;
        auVar203._8_4_ = 0xff800000;
        auVar203._0_8_ = 0xff800000ff800000;
        auVar203._12_4_ = 0xff800000;
        auVar203._16_4_ = 0xff800000;
        auVar203._20_4_ = 0xff800000;
        auVar203._24_4_ = 0xff800000;
        auVar203._28_4_ = 0xff800000;
        auVar97 = vblendmps_avx512vl(auVar203,auVar47);
        bVar69 = (bool)((byte)uVar60 & 1);
        auVar131._0_4_ = (uint)bVar69 * auVar97._0_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar69 * auVar97._4_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar69 * auVar97._8_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar69 * auVar97._12_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar69 * auVar97._16_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar69 * auVar97._20_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar69 * auVar97._24_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = SUB81(uVar60 >> 7,0);
        auVar131._28_4_ = (uint)bVar69 * auVar97._28_4_ | (uint)!bVar69 * -0x800000;
        vandps_avx512vl(auVar110,local_900);
        auVar97 = vmaxps_avx(local_600,auVar131);
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar97 = vmulps_avx512vl(auVar97,auVar34);
        vandps_avx512vl(auVar105,auVar110);
        uVar59 = vcmpps_avx512vl(auVar97,auVar97,1);
        uVar60 = uVar60 & uVar59;
        bVar57 = (byte)uVar60;
        if (bVar57 != 0) {
          uVar59 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar73),2);
          auVar236._8_4_ = 0xff800000;
          auVar236._0_8_ = 0xff800000ff800000;
          auVar236._12_4_ = 0xff800000;
          auVar236._16_4_ = 0xff800000;
          auVar236._20_4_ = 0xff800000;
          auVar236._24_4_ = 0xff800000;
          auVar236._28_4_ = 0xff800000;
          auVar239._8_4_ = 0x7f800000;
          auVar239._0_8_ = 0x7f8000007f800000;
          auVar239._12_4_ = 0x7f800000;
          auVar239._16_4_ = 0x7f800000;
          auVar239._20_4_ = 0x7f800000;
          auVar239._24_4_ = 0x7f800000;
          auVar239._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar239,auVar236);
          bVar61 = (byte)uVar59;
          uVar72 = (uint)(bVar61 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar97._0_4_;
          bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
          uVar137 = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * auVar97._4_4_;
          bVar69 = (bool)((byte)(uVar59 >> 2) & 1);
          uVar138 = (uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * auVar97._8_4_;
          bVar69 = (bool)((byte)(uVar59 >> 3) & 1);
          uVar139 = (uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * auVar97._12_4_;
          bVar69 = (bool)((byte)(uVar59 >> 4) & 1);
          uVar140 = (uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * auVar97._16_4_;
          bVar69 = (bool)((byte)(uVar59 >> 5) & 1);
          uVar141 = (uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * auVar97._20_4_;
          bVar69 = (bool)((byte)(uVar59 >> 6) & 1);
          uVar142 = (uint)bVar69 * auVar96._24_4_ | (uint)!bVar69 * auVar97._24_4_;
          bVar69 = SUB81(uVar59 >> 7,0);
          uVar143 = (uint)bVar69 * auVar96._28_4_ | (uint)!bVar69 * auVar97._28_4_;
          auVar130._0_4_ = (bVar57 & 1) * uVar72 | !(bool)(bVar57 & 1) * auVar130._0_4_;
          bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar130._4_4_ = bVar69 * uVar137 | !bVar69 * auVar130._4_4_;
          bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar130._8_4_ = bVar69 * uVar138 | !bVar69 * auVar130._8_4_;
          bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar130._12_4_ = bVar69 * uVar139 | !bVar69 * auVar130._12_4_;
          bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar130._16_4_ = bVar69 * uVar140 | !bVar69 * auVar130._16_4_;
          bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar130._20_4_ = bVar69 * uVar141 | !bVar69 * auVar130._20_4_;
          bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar130._24_4_ = bVar69 * uVar142 | !bVar69 * auVar130._24_4_;
          bVar69 = SUB81(uVar60 >> 7,0);
          auVar130._28_4_ = bVar69 * uVar143 | !bVar69 * auVar130._28_4_;
          auVar96 = vblendmps_avx512vl(auVar236,auVar239);
          bVar69 = (bool)((byte)(uVar59 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar59 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar59 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar59 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar59 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
          bVar11 = SUB81(uVar59 >> 7,0);
          auVar131._0_4_ =
               (uint)(bVar57 & 1) *
               ((uint)(bVar61 & 1) * auVar96._0_4_ | !(bool)(bVar61 & 1) * uVar72) |
               !(bool)(bVar57 & 1) * auVar131._0_4_;
          bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar131._4_4_ =
               (uint)bVar5 * ((uint)bVar69 * auVar96._4_4_ | !bVar69 * uVar137) |
               !bVar5 * auVar131._4_4_;
          bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar131._8_4_ =
               (uint)bVar69 * ((uint)bVar6 * auVar96._8_4_ | !bVar6 * uVar138) |
               !bVar69 * auVar131._8_4_;
          bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar131._12_4_ =
               (uint)bVar69 * ((uint)bVar7 * auVar96._12_4_ | !bVar7 * uVar139) |
               !bVar69 * auVar131._12_4_;
          bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar131._16_4_ =
               (uint)bVar69 * ((uint)bVar8 * auVar96._16_4_ | !bVar8 * uVar140) |
               !bVar69 * auVar131._16_4_;
          bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar131._20_4_ =
               (uint)bVar69 * ((uint)bVar9 * auVar96._20_4_ | !bVar9 * uVar141) |
               !bVar69 * auVar131._20_4_;
          bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar131._24_4_ =
               (uint)bVar69 * ((uint)bVar10 * auVar96._24_4_ | !bVar10 * uVar142) |
               !bVar69 * auVar131._24_4_;
          bVar69 = SUB81(uVar60 >> 7,0);
          auVar131._28_4_ =
               (uint)bVar69 * ((uint)bVar11 * auVar96._28_4_ | !bVar11 * uVar143) |
               !bVar69 * auVar131._28_4_;
          bVar62 = (~bVar57 | bVar61) & bVar62;
        }
      }
      auVar96 = vmulps_avx512vl(local_740,auVar83);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar89,auVar82);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar88,auVar99);
      _local_500 = _local_7a0;
      local_4e0 = vminps_avx(local_5c0,auVar130);
      vandps_avx512vl(auVar96,auVar110);
      _local_6a0 = vmaxps_avx(_local_7a0,auVar131);
      _local_5e0 = _local_6a0;
      auVar204._8_4_ = 0x3e99999a;
      auVar204._0_8_ = 0x3e99999a3e99999a;
      auVar204._12_4_ = 0x3e99999a;
      auVar204._16_4_ = 0x3e99999a;
      auVar204._20_4_ = 0x3e99999a;
      auVar204._24_4_ = 0x3e99999a;
      auVar204._28_4_ = 0x3e99999a;
      uVar21 = vcmpps_avx512vl(auVar96,auVar204,1);
      uVar23 = vcmpps_avx512vl(_local_7a0,local_4e0,2);
      bVar57 = (byte)uVar23 & bVar58;
      uVar22 = vcmpps_avx512vl(_local_6a0,local_5c0,2);
      auVar244 = ZEXT3264(local_920);
      auVar245 = ZEXT3264(local_940);
      if ((bVar58 & ((byte)uVar22 | (byte)uVar23)) == 0) {
        auVar212 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar164 = ZEXT3264(local_840);
        auVar219 = ZEXT3264(local_9c0);
      }
      else {
        auVar96 = vmulps_avx512vl(local_740,auVar98);
        auVar96 = vfmadd213ps_avx512vl(auVar102,auVar89,auVar96);
        auVar96 = vfmadd213ps_avx512vl(auVar100,auVar88,auVar96);
        vandps_avx512vl(auVar96,auVar110);
        uVar23 = vcmpps_avx512vl(auVar96,auVar204,1);
        bVar61 = (byte)uVar23 | ~bVar62;
        auVar158._8_4_ = 2;
        auVar158._0_8_ = 0x200000002;
        auVar158._12_4_ = 2;
        auVar158._16_4_ = 2;
        auVar158._20_4_ = 2;
        auVar158._24_4_ = 2;
        auVar158._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar158,auVar35);
        local_5a0._0_4_ = (uint)(bVar61 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar69 = (bool)(bVar61 >> 1 & 1);
        local_5a0._4_4_ = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 2 & 1);
        local_5a0._8_4_ = (uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 3 & 1);
        local_5a0._12_4_ = (uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 4 & 1);
        local_5a0._16_4_ = (uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 5 & 1);
        local_5a0._20_4_ = (uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar61 >> 6 & 1);
        local_5a0._24_4_ = (uint)bVar69 * auVar96._24_4_ | (uint)!bVar69 * 2;
        local_5a0._28_4_ = (uint)(bVar61 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
        local_620 = vpbroadcastd_avx512vl();
        uVar23 = vpcmpd_avx512vl(local_620,local_5a0,5);
        bVar61 = (byte)uVar23 & bVar57;
        if (bVar61 == 0) {
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
        }
        else {
          auVar76 = vminps_avx(local_7c0._0_16_,local_800._0_16_);
          auVar75 = vmaxps_avx(local_7c0._0_16_,local_800._0_16_);
          auVar73 = vminps_avx(local_7e0._0_16_,local_820._0_16_);
          auVar77 = vminps_avx(auVar76,auVar73);
          auVar76 = vmaxps_avx(local_7e0._0_16_,local_820._0_16_);
          auVar73 = vmaxps_avx(auVar75,auVar76);
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar77,auVar187);
          auVar76 = vandps_avx(auVar73,auVar187);
          auVar75 = vmaxps_avx(auVar75,auVar76);
          auVar76 = vmovshdup_avx(auVar75);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          fVar224 = auVar75._0_4_ * 1.9073486e-06;
          local_8a0 = vshufps_avx(auVar73,auVar73,0xff);
          local_680 = (float)local_7a0._0_4_ + (float)local_720._0_4_;
          fStack_67c = (float)local_7a0._4_4_ + (float)local_720._4_4_;
          fStack_678 = fStack_798 + fStack_718;
          fStack_674 = fStack_794 + fStack_714;
          fStack_670 = fStack_790 + fStack_710;
          fStack_66c = fStack_78c + fStack_70c;
          fStack_668 = fStack_788 + fStack_708;
          fStack_664 = fStack_784 + fStack_704;
          do {
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar96 = vblendmps_avx512vl(auVar159,_local_7a0);
            auVar132._0_4_ =
                 (uint)(bVar61 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar61 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar132._24_4_ =
                 (uint)(bVar61 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar96 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar96 = vminps_avx(auVar132,auVar96);
            auVar82 = vshufpd_avx(auVar96,auVar96,5);
            auVar96 = vminps_avx(auVar96,auVar82);
            auVar82 = vpermpd_avx2(auVar96,0x4e);
            auVar96 = vminps_avx(auVar96,auVar82);
            uVar23 = vcmpps_avx512vl(auVar132,auVar96,0);
            bVar55 = (byte)uVar23 & bVar61;
            bVar66 = bVar61;
            if (bVar55 != 0) {
              bVar66 = bVar55;
            }
            iVar24 = 0;
            for (uVar72 = (uint)bVar66; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            bVar66 = '\x01' << ((byte)iVar24 & 0x1f);
            uVar72 = *(uint *)(local_640 + (uint)(iVar24 << 2));
            fVar231 = *(float *)(local_500 + (uint)(iVar24 << 2));
            fVar232 = auVar19._0_4_;
            if ((float)local_970._0_4_ < 0.0) {
              fVar232 = sqrtf((float)local_970._0_4_);
            }
            auVar246 = ZEXT464(uVar72);
            bVar55 = ~bVar66;
            lVar67 = 5;
            do {
              auVar146._4_4_ = fVar231;
              auVar146._0_4_ = fVar231;
              auVar146._8_4_ = fVar231;
              auVar146._12_4_ = fVar231;
              auVar76 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_950);
              fVar238 = auVar246._0_4_;
              fVar233 = 1.0 - fVar238;
              auVar188._0_4_ = local_800._0_4_ * fVar238;
              auVar188._4_4_ = local_800._4_4_ * fVar238;
              auVar188._8_4_ = local_800._8_4_ * fVar238;
              auVar188._12_4_ = local_800._12_4_ * fVar238;
              local_780._0_16_ = ZEXT416((uint)fVar233);
              auVar207._4_4_ = fVar233;
              auVar207._0_4_ = fVar233;
              auVar207._8_4_ = fVar233;
              auVar207._12_4_ = fVar233;
              auVar75 = vfmadd231ps_fma(auVar188,auVar207,local_7c0._0_16_);
              auVar213._0_4_ = local_7e0._0_4_ * fVar238;
              auVar213._4_4_ = local_7e0._4_4_ * fVar238;
              auVar213._8_4_ = local_7e0._8_4_ * fVar238;
              auVar213._12_4_ = local_7e0._12_4_ * fVar238;
              auVar73 = vfmadd231ps_fma(auVar213,auVar207,local_800._0_16_);
              auVar220._0_4_ = fVar238 * (float)local_820._0_4_;
              auVar220._4_4_ = fVar238 * (float)local_820._4_4_;
              auVar220._8_4_ = fVar238 * fStack_818;
              auVar220._12_4_ = fVar238 * fStack_814;
              auVar77 = vfmadd231ps_fma(auVar220,auVar207,local_7e0._0_16_);
              auVar227._0_4_ = fVar238 * auVar73._0_4_;
              auVar227._4_4_ = fVar238 * auVar73._4_4_;
              auVar227._8_4_ = fVar238 * auVar73._8_4_;
              auVar227._12_4_ = fVar238 * auVar73._12_4_;
              auVar75 = vfmadd231ps_fma(auVar227,auVar207,auVar75);
              auVar189._0_4_ = fVar238 * auVar77._0_4_;
              auVar189._4_4_ = fVar238 * auVar77._4_4_;
              auVar189._8_4_ = fVar238 * auVar77._8_4_;
              auVar189._12_4_ = fVar238 * auVar77._12_4_;
              auVar73 = vfmadd231ps_fma(auVar189,auVar207,auVar73);
              auVar214._0_4_ = fVar238 * auVar73._0_4_;
              auVar214._4_4_ = fVar238 * auVar73._4_4_;
              auVar214._8_4_ = fVar238 * auVar73._8_4_;
              auVar214._12_4_ = fVar238 * auVar73._12_4_;
              auVar77 = vfmadd231ps_fma(auVar214,auVar75,auVar207);
              auVar75 = vsubps_avx(auVar73,auVar75);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar73 = vmulps_avx512vl(auVar75,auVar25);
              local_760._0_16_ = auVar77;
              auVar75 = vsubps_avx(auVar76,auVar77);
              local_9a0._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_8e0._0_16_ = auVar75;
              if (auVar75._0_4_ < 0.0) {
                auVar164._0_4_ = sqrtf(auVar75._0_4_);
                auVar164._4_60_ = extraout_var;
                auVar75 = auVar164._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
              }
              local_850 = vdpps_avx(auVar73,auVar73,0x7f);
              fVar233 = local_850._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar233;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              fVar145 = auVar76._0_4_;
              local_860 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_850,auVar26);
              auVar76 = vfnmadd213ss_fma(local_860,local_850,ZEXT416(0x40000000));
              local_900._0_4_ = auVar75._0_4_;
              if (fVar233 < auVar77._0_4_) {
                fVar234 = sqrtf(fVar233);
                auVar75 = ZEXT416((uint)local_900._0_4_);
              }
              else {
                auVar77 = vsqrtss_avx(local_850,local_850);
                fVar234 = auVar77._0_4_;
              }
              local_960._0_4_ = fVar234;
              fVar233 = fVar145 * 1.5 + fVar233 * -0.5 * fVar145 * fVar145 * fVar145;
              local_870._0_4_ = auVar73._0_4_ * fVar233;
              local_870._4_4_ = auVar73._4_4_ * fVar233;
              local_870._8_4_ = auVar73._8_4_ * fVar233;
              local_870._12_4_ = auVar73._12_4_ * fVar233;
              auVar77 = vdpps_avx(local_9a0._0_16_,local_870,0x7f);
              auVar74 = vaddss_avx512f(auVar75,ZEXT416(0x3f800000));
              auVar147._0_4_ = auVar77._0_4_ * auVar77._0_4_;
              auVar147._4_4_ = auVar77._4_4_ * auVar77._4_4_;
              auVar147._8_4_ = auVar77._8_4_ * auVar77._8_4_;
              auVar147._12_4_ = auVar77._12_4_ * auVar77._12_4_;
              auVar80 = vsubps_avx(local_8e0._0_16_,auVar147);
              fVar145 = auVar80._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar145;
              auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              fVar234 = auVar78._0_4_;
              uVar70 = fVar145 == 0.0;
              uVar68 = fVar145 < 0.0;
              if ((bool)uVar68) {
                local_880 = fVar233;
                fStack_87c = fVar233;
                fStack_878 = fVar233;
                fStack_874 = fVar233;
                fVar206 = sqrtf(fVar145);
                auVar75 = ZEXT416((uint)local_900._0_4_);
                auVar74 = ZEXT416(auVar74._0_4_);
                fVar233 = local_880;
                fVar235 = fStack_87c;
                fVar242 = fStack_878;
                fVar166 = fStack_874;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                fVar206 = auVar80._0_4_;
                fVar235 = fVar233;
                fVar242 = fVar233;
                fVar166 = fVar233;
              }
              auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar246._0_16_,
                                        local_780._0_16_);
              fVar165 = auVar80._0_4_ * 6.0;
              fVar20 = fVar238 * 6.0;
              auVar191._0_4_ = fVar20 * (float)local_820._0_4_;
              auVar191._4_4_ = fVar20 * (float)local_820._4_4_;
              auVar191._8_4_ = fVar20 * fStack_818;
              auVar191._12_4_ = fVar20 * fStack_814;
              auVar168._4_4_ = fVar165;
              auVar168._0_4_ = fVar165;
              auVar168._8_4_ = fVar165;
              auVar168._12_4_ = fVar165;
              auVar80 = vfmadd132ps_fma(auVar168,auVar191,local_7e0._0_16_);
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,
                                        auVar246._0_16_);
              fVar165 = auVar78._0_4_ * 6.0;
              auVar192._4_4_ = fVar165;
              auVar192._0_4_ = fVar165;
              auVar192._8_4_ = fVar165;
              auVar192._12_4_ = fVar165;
              auVar80 = vfmadd132ps_fma(auVar192,auVar80,local_800._0_16_);
              fVar165 = local_780._0_4_ * 6.0;
              auVar169._4_4_ = fVar165;
              auVar169._0_4_ = fVar165;
              auVar169._8_4_ = fVar165;
              auVar169._12_4_ = fVar165;
              auVar80 = vfmadd132ps_fma(auVar169,auVar80,local_7c0._0_16_);
              auVar193._0_4_ = auVar80._0_4_ * (float)local_850._0_4_;
              auVar193._4_4_ = auVar80._4_4_ * (float)local_850._0_4_;
              auVar193._8_4_ = auVar80._8_4_ * (float)local_850._0_4_;
              auVar193._12_4_ = auVar80._12_4_ * (float)local_850._0_4_;
              auVar80 = vdpps_avx(auVar73,auVar80,0x7f);
              fVar165 = auVar80._0_4_;
              auVar170._0_4_ = auVar73._0_4_ * fVar165;
              auVar170._4_4_ = auVar73._4_4_ * fVar165;
              auVar170._8_4_ = auVar73._8_4_ * fVar165;
              auVar170._12_4_ = auVar73._12_4_ * fVar165;
              auVar80 = vsubps_avx(auVar193,auVar170);
              fVar165 = auVar76._0_4_ * (float)local_860._0_4_;
              auVar78 = vmaxss_avx(ZEXT416((uint)fVar224),
                                   ZEXT416((uint)(fVar231 * fVar232 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(auVar73,auVar27);
              auVar194._0_4_ = fVar233 * auVar80._0_4_ * fVar165;
              auVar194._4_4_ = fVar235 * auVar80._4_4_ * fVar165;
              auVar194._8_4_ = fVar242 * auVar80._8_4_ * fVar165;
              auVar194._12_4_ = fVar166 * auVar80._12_4_ * fVar165;
              auVar76 = vdpps_avx(auVar79,local_870,0x7f);
              auVar80 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar224),auVar78);
              auVar75 = vdpps_avx(local_9a0._0_16_,auVar194,0x7f);
              vfmadd213ss_avx512f(auVar74,ZEXT416((uint)(fVar224 / (float)local_960._0_4_)),auVar80)
              ;
              fVar233 = auVar76._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_950,local_870,0x7f);
              auVar76 = vdpps_avx(local_9a0._0_16_,auVar79,0x7f);
              fVar145 = fVar234 * fVar145 * -0.5 * fVar234 * fVar234 + fVar234 * 1.5;
              auVar80 = vdpps_avx(local_9a0._0_16_,local_950,0x7f);
              auVar74 = vfnmadd231ss_avx512f(auVar76,auVar77,ZEXT416((uint)fVar233));
              auVar79 = vfnmadd231ss_avx512f(auVar80,auVar77,auVar75);
              auVar76 = vpermilps_avx(local_760._0_16_,0xff);
              fVar206 = fVar206 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar73,auVar73,0xff);
              auVar80 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar145),auVar76);
              fVar145 = auVar79._0_4_ * fVar145;
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar80._0_4_)),
                                        ZEXT416((uint)fVar233),ZEXT416((uint)fVar145));
              fVar234 = auVar74._0_4_;
              auVar228._0_4_ = fVar145 / fVar234;
              auVar228._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar208._0_4_ = auVar80._0_4_ / fVar234;
              auVar208._4_12_ = auVar80._4_12_;
              auVar80 = vmulss_avx512f(auVar77,auVar228);
              auVar74 = vmulss_avx512f(auVar77,auVar208);
              fVar238 = fVar238 - (auVar80._0_4_ - fVar206 * (auVar75._0_4_ / fVar234));
              auVar246 = ZEXT464((uint)fVar238);
              fVar231 = fVar231 - (fVar206 * (fVar233 / fVar234) - auVar74._0_4_);
              auVar215._8_4_ = 0x7fffffff;
              auVar215._0_8_ = 0x7fffffff7fffffff;
              auVar215._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(auVar77,auVar215);
              auVar75 = vucomiss_avx512f(auVar75);
              in_ZMM31 = ZEXT1664(auVar75);
              bVar69 = true;
              if (!(bool)uVar68 && !(bool)uVar70) {
                auVar75 = vaddss_avx512f(auVar78,auVar75);
                auVar77 = vfmadd231ss_fma(auVar75,local_8a0,ZEXT416(0x36000000));
                auVar75 = vandps_avx(ZEXT416((uint)fVar206),auVar215);
                if (auVar75._0_4_ < auVar77._0_4_) {
                  fVar231 = fVar231 + (float)local_890._0_4_;
                  if ((((fVar144 <= fVar231) &&
                       (fVar233 = *(float *)(ray + k * 4 + 0x200), fVar231 <= fVar233)) &&
                      (0.0 <= fVar238)) && (fVar238 <= 1.0)) {
                    auVar50._12_4_ = 0;
                    auVar50._0_12_ = ZEXT812(0);
                    auVar75 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)local_8e0._0_4_));
                    fVar145 = auVar75._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar66 = true;
                      }
                      else {
                        fVar145 = fVar145 * 1.5 +
                                  (float)local_8e0._0_4_ * -0.5 * fVar145 * fVar145 * fVar145;
                        auVar171._0_4_ = local_9a0._0_4_ * fVar145;
                        auVar171._4_4_ = local_9a0._4_4_ * fVar145;
                        auVar171._8_4_ = local_9a0._8_4_ * fVar145;
                        auVar171._12_4_ = local_9a0._12_4_ * fVar145;
                        auVar77 = vfmadd213ps_fma(auVar76,auVar171,auVar73);
                        auVar75 = vshufps_avx(auVar171,auVar171,0xc9);
                        auVar76 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar172._0_4_ = auVar171._0_4_ * auVar76._0_4_;
                        auVar172._4_4_ = auVar171._4_4_ * auVar76._4_4_;
                        auVar172._8_4_ = auVar171._8_4_ * auVar76._8_4_;
                        auVar172._12_4_ = auVar171._12_4_ * auVar76._12_4_;
                        auVar73 = vfmsub231ps_fma(auVar172,auVar73,auVar75);
                        auVar75 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                        auVar148._0_4_ = auVar77._0_4_ * auVar73._0_4_;
                        auVar148._4_4_ = auVar77._4_4_ * auVar73._4_4_;
                        auVar148._8_4_ = auVar77._8_4_ * auVar73._8_4_;
                        auVar148._12_4_ = auVar77._12_4_ * auVar73._12_4_;
                        auVar75 = vfmsub231ps_fma(auVar148,auVar75,auVar76);
                        auVar76 = ZEXT416((uint)fVar238);
                        local_340 = vbroadcastss_avx512f(auVar76);
                        auVar164 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar164 = vpermps_avx512f(auVar164,ZEXT1664(auVar75));
                        auVar212 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar212,ZEXT1664(auVar75));
                        local_380 = vbroadcastss_avx512f(auVar75);
                        local_400[0] = (RTCHitN)auVar164[0];
                        local_400[1] = (RTCHitN)auVar164[1];
                        local_400[2] = (RTCHitN)auVar164[2];
                        local_400[3] = (RTCHitN)auVar164[3];
                        local_400[4] = (RTCHitN)auVar164[4];
                        local_400[5] = (RTCHitN)auVar164[5];
                        local_400[6] = (RTCHitN)auVar164[6];
                        local_400[7] = (RTCHitN)auVar164[7];
                        local_400[8] = (RTCHitN)auVar164[8];
                        local_400[9] = (RTCHitN)auVar164[9];
                        local_400[10] = (RTCHitN)auVar164[10];
                        local_400[0xb] = (RTCHitN)auVar164[0xb];
                        local_400[0xc] = (RTCHitN)auVar164[0xc];
                        local_400[0xd] = (RTCHitN)auVar164[0xd];
                        local_400[0xe] = (RTCHitN)auVar164[0xe];
                        local_400[0xf] = (RTCHitN)auVar164[0xf];
                        local_400[0x10] = (RTCHitN)auVar164[0x10];
                        local_400[0x11] = (RTCHitN)auVar164[0x11];
                        local_400[0x12] = (RTCHitN)auVar164[0x12];
                        local_400[0x13] = (RTCHitN)auVar164[0x13];
                        local_400[0x14] = (RTCHitN)auVar164[0x14];
                        local_400[0x15] = (RTCHitN)auVar164[0x15];
                        local_400[0x16] = (RTCHitN)auVar164[0x16];
                        local_400[0x17] = (RTCHitN)auVar164[0x17];
                        local_400[0x18] = (RTCHitN)auVar164[0x18];
                        local_400[0x19] = (RTCHitN)auVar164[0x19];
                        local_400[0x1a] = (RTCHitN)auVar164[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar164[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar164[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar164[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar164[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar164[0x1f];
                        local_400[0x20] = (RTCHitN)auVar164[0x20];
                        local_400[0x21] = (RTCHitN)auVar164[0x21];
                        local_400[0x22] = (RTCHitN)auVar164[0x22];
                        local_400[0x23] = (RTCHitN)auVar164[0x23];
                        local_400[0x24] = (RTCHitN)auVar164[0x24];
                        local_400[0x25] = (RTCHitN)auVar164[0x25];
                        local_400[0x26] = (RTCHitN)auVar164[0x26];
                        local_400[0x27] = (RTCHitN)auVar164[0x27];
                        local_400[0x28] = (RTCHitN)auVar164[0x28];
                        local_400[0x29] = (RTCHitN)auVar164[0x29];
                        local_400[0x2a] = (RTCHitN)auVar164[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar164[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar164[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar164[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar164[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar164[0x2f];
                        local_400[0x30] = (RTCHitN)auVar164[0x30];
                        local_400[0x31] = (RTCHitN)auVar164[0x31];
                        local_400[0x32] = (RTCHitN)auVar164[0x32];
                        local_400[0x33] = (RTCHitN)auVar164[0x33];
                        local_400[0x34] = (RTCHitN)auVar164[0x34];
                        local_400[0x35] = (RTCHitN)auVar164[0x35];
                        local_400[0x36] = (RTCHitN)auVar164[0x36];
                        local_400[0x37] = (RTCHitN)auVar164[0x37];
                        local_400[0x38] = (RTCHitN)auVar164[0x38];
                        local_400[0x39] = (RTCHitN)auVar164[0x39];
                        local_400[0x3a] = (RTCHitN)auVar164[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar164[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar164[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar164[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar164[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar164[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_440._0_8_;
                        uStack_2b8 = local_440._8_8_;
                        uStack_2b0 = local_440._16_8_;
                        uStack_2a8 = local_440._24_8_;
                        uStack_2a0 = local_440._32_8_;
                        uStack_298 = local_440._40_8_;
                        uStack_290 = local_440._48_8_;
                        uStack_288 = local_440._56_8_;
                        auVar164 = vmovdqa64_avx512f(local_480);
                        local_280 = vmovdqa64_avx512f(auVar164);
                        vpcmpeqd_avx2(auVar164._0_32_,auVar164._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar231;
                        local_700 = local_4c0;
                        local_9f0.valid = (int *)local_700;
                        local_9f0.geometryUserPtr = pGVar3->userPtr;
                        local_9f0.context = context->user;
                        local_9f0.hit = local_400;
                        local_9f0.N = 0x10;
                        local_9f0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->occlusionFilterN)(&local_9f0);
                          auVar246 = ZEXT1664(auVar76);
                          auVar215._8_4_ = 0x7fffffff;
                          auVar215._0_8_ = 0x7fffffff7fffffff;
                          auVar215._12_4_ = 0x7fffffff;
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        }
                        auVar164 = vmovdqa64_avx512f(local_700);
                        uVar23 = vptestmd_avx512f(auVar164,auVar164);
                        if ((short)uVar23 == 0) {
                          bVar66 = false;
                        }
                        else {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var4)(&local_9f0);
                            auVar246 = ZEXT1664(auVar76);
                            auVar215._8_4_ = 0x7fffffff;
                            auVar215._0_8_ = 0x7fffffff7fffffff;
                            auVar215._12_4_ = 0x7fffffff;
                            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          }
                          auVar164 = vmovdqa64_avx512f(local_700);
                          uVar60 = vptestmd_avx512f(auVar164,auVar164);
                          auVar164 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar69 = (bool)((byte)uVar60 & 1);
                          auVar212._0_4_ =
                               (uint)bVar69 * auVar164._0_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x200);
                          bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
                          auVar212._4_4_ =
                               (uint)bVar69 * auVar164._4_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x204);
                          bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
                          auVar212._8_4_ =
                               (uint)bVar69 * auVar164._8_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x208);
                          bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
                          auVar212._12_4_ =
                               (uint)bVar69 * auVar164._12_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x20c);
                          bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
                          auVar212._16_4_ =
                               (uint)bVar69 * auVar164._16_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x210);
                          bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
                          auVar212._20_4_ =
                               (uint)bVar69 * auVar164._20_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x214);
                          bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
                          auVar212._24_4_ =
                               (uint)bVar69 * auVar164._24_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x218);
                          bVar69 = (bool)((byte)(uVar60 >> 7) & 1);
                          auVar212._28_4_ =
                               (uint)bVar69 * auVar164._28_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x21c);
                          bVar69 = (bool)((byte)(uVar60 >> 8) & 1);
                          auVar212._32_4_ =
                               (uint)bVar69 * auVar164._32_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x220);
                          bVar69 = (bool)((byte)(uVar60 >> 9) & 1);
                          auVar212._36_4_ =
                               (uint)bVar69 * auVar164._36_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x224);
                          bVar69 = (bool)((byte)(uVar60 >> 10) & 1);
                          auVar212._40_4_ =
                               (uint)bVar69 * auVar164._40_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x228);
                          bVar69 = (bool)((byte)(uVar60 >> 0xb) & 1);
                          auVar212._44_4_ =
                               (uint)bVar69 * auVar164._44_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x22c);
                          bVar69 = (bool)((byte)(uVar60 >> 0xc) & 1);
                          auVar212._48_4_ =
                               (uint)bVar69 * auVar164._48_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x230);
                          bVar69 = (bool)((byte)(uVar60 >> 0xd) & 1);
                          auVar212._52_4_ =
                               (uint)bVar69 * auVar164._52_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x234);
                          bVar69 = (bool)((byte)(uVar60 >> 0xe) & 1);
                          auVar212._56_4_ =
                               (uint)bVar69 * auVar164._56_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x238);
                          bVar69 = SUB81(uVar60 >> 0xf,0);
                          auVar212._60_4_ =
                               (uint)bVar69 * auVar164._60_4_ |
                               (uint)!bVar69 * *(int *)(local_9f0.ray + 0x23c);
                          *(undefined1 (*) [64])(local_9f0.ray + 0x200) = auVar212;
                          bVar66 = (short)uVar60 != 0;
                        }
                        if ((bool)bVar66 == false) {
                          *(float *)(ray + k * 4 + 0x200) = fVar233;
                        }
                      }
                      bVar69 = false;
                      goto LAB_01df0f4b;
                    }
                  }
                  bVar69 = false;
                  bVar66 = 0;
                }
              }
LAB_01df0f4b:
              if (!bVar69) goto LAB_01df1370;
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
            bVar66 = 0;
LAB_01df1370:
            bVar65 = bVar65 | bVar66 & 1;
            auVar52._4_4_ = fStack_67c;
            auVar52._0_4_ = local_680;
            auVar52._8_4_ = fStack_678;
            auVar52._12_4_ = fStack_674;
            auVar52._16_4_ = fStack_670;
            auVar52._20_4_ = fStack_66c;
            auVar52._24_4_ = fStack_668;
            auVar52._28_4_ = fStack_664;
            uVar223 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar36._4_4_ = uVar223;
            auVar36._0_4_ = uVar223;
            auVar36._8_4_ = uVar223;
            auVar36._12_4_ = uVar223;
            auVar36._16_4_ = uVar223;
            auVar36._20_4_ = uVar223;
            auVar36._24_4_ = uVar223;
            auVar36._28_4_ = uVar223;
            uVar23 = vcmpps_avx512vl(auVar52,auVar36,2);
            bVar61 = bVar55 & bVar61 & (byte)uVar23;
            auVar246 = ZEXT3264(auVar96);
          } while (bVar61 != 0);
        }
        auVar160._0_4_ = (float)local_720._0_4_ + (float)local_6a0._0_4_;
        auVar160._4_4_ = (float)local_720._4_4_ + (float)local_6a0._4_4_;
        auVar160._8_4_ = fStack_718 + fStack_698;
        auVar160._12_4_ = fStack_714 + fStack_694;
        auVar160._16_4_ = fStack_710 + fStack_690;
        auVar160._20_4_ = fStack_70c + fStack_68c;
        auVar160._24_4_ = fStack_708 + fStack_688;
        auVar160._28_4_ = fStack_704 + fStack_684;
        uVar223 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar37._4_4_ = uVar223;
        auVar37._0_4_ = uVar223;
        auVar37._8_4_ = uVar223;
        auVar37._12_4_ = uVar223;
        auVar37._16_4_ = uVar223;
        auVar37._20_4_ = uVar223;
        auVar37._24_4_ = uVar223;
        auVar37._28_4_ = uVar223;
        uVar23 = vcmpps_avx512vl(auVar160,auVar37,2);
        bVar62 = (byte)uVar21 | ~bVar62;
        bVar58 = (byte)uVar22 & bVar58 & (byte)uVar23;
        auVar161._8_4_ = 2;
        auVar161._0_8_ = 0x200000002;
        auVar161._12_4_ = 2;
        auVar161._16_4_ = 2;
        auVar161._20_4_ = 2;
        auVar161._24_4_ = 2;
        auVar161._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar96 = vpblendmd_avx512vl(auVar161,auVar38);
        local_6a0._0_4_ = (uint)(bVar62 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar69 = (bool)(bVar62 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar62 >> 2 & 1);
        fStack_698 = (float)((uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar62 >> 3 & 1);
        fStack_694 = (float)((uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar62 >> 4 & 1);
        fStack_690 = (float)((uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar62 >> 5 & 1);
        fStack_68c = (float)((uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar62 >> 6 & 1);
        fStack_688 = (float)((uint)bVar69 * auVar96._24_4_ | (uint)!bVar69 * 2);
        fStack_684 = (float)((uint)(bVar62 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2);
        uVar21 = vpcmpd_avx512vl(_local_6a0,local_620,2);
        bVar62 = (byte)uVar21 & bVar58;
        if (bVar62 == 0) {
          auVar219 = ZEXT3264(local_9c0);
          auVar244 = ZEXT3264(local_920);
          auVar245 = ZEXT3264(local_940);
        }
        else {
          auVar76 = vminps_avx(local_7c0._0_16_,local_800._0_16_);
          auVar75 = vmaxps_avx(local_7c0._0_16_,local_800._0_16_);
          auVar73 = vminps_avx(local_7e0._0_16_,local_820._0_16_);
          auVar77 = vminps_avx(auVar76,auVar73);
          auVar76 = vmaxps_avx(local_7e0._0_16_,local_820._0_16_);
          auVar73 = vmaxps_avx(auVar75,auVar76);
          auVar75 = vandps_avx(auVar77,auVar215);
          auVar76 = vandps_avx(auVar73,auVar215);
          auVar75 = vmaxps_avx(auVar75,auVar76);
          auVar76 = vmovshdup_avx(auVar75);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          fVar224 = auVar75._0_4_ * 1.9073486e-06;
          local_8a0 = vshufps_avx(auVar73,auVar73,0xff);
          _local_7a0 = _local_5e0;
          local_680 = (float)local_720._0_4_ + (float)local_5e0._0_4_;
          fStack_67c = (float)local_720._4_4_ + (float)local_5e0._4_4_;
          fStack_678 = fStack_718 + fStack_5d8;
          fStack_674 = fStack_714 + fStack_5d4;
          fStack_670 = fStack_710 + fStack_5d0;
          fStack_66c = fStack_70c + fStack_5cc;
          fStack_668 = fStack_708 + fStack_5c8;
          fStack_664 = fStack_704 + fStack_5c4;
          do {
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar96 = vblendmps_avx512vl(auVar162,_local_7a0);
            auVar133._0_4_ =
                 (uint)(bVar62 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar69 * auVar96._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar69 * auVar96._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar69 * auVar96._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar69 * auVar96._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar62 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar69 * auVar96._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar62 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar96 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar96 = vminps_avx(auVar133,auVar96);
            auVar82 = vshufpd_avx(auVar96,auVar96,5);
            auVar96 = vminps_avx(auVar96,auVar82);
            auVar82 = vpermpd_avx2(auVar96,0x4e);
            auVar96 = vminps_avx(auVar96,auVar82);
            uVar21 = vcmpps_avx512vl(auVar133,auVar96,0);
            bVar66 = (byte)uVar21 & bVar62;
            bVar61 = bVar62;
            if (bVar66 != 0) {
              bVar61 = bVar66;
            }
            iVar24 = 0;
            for (uVar72 = (uint)bVar61; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            bVar61 = '\x01' << ((byte)iVar24 & 0x1f);
            uVar72 = *(uint *)(local_660 + (uint)(iVar24 << 2));
            fVar231 = *(float *)(local_5c0 + (uint)(iVar24 << 2));
            fVar232 = auVar18._0_4_;
            if ((float)local_970._0_4_ < 0.0) {
              fVar232 = sqrtf((float)local_970._0_4_);
            }
            auVar164 = ZEXT464(uVar72);
            bVar66 = ~bVar61;
            lVar67 = 5;
            do {
              auVar149._4_4_ = fVar231;
              auVar149._0_4_ = fVar231;
              auVar149._8_4_ = fVar231;
              auVar149._12_4_ = fVar231;
              auVar76 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_950);
              fVar238 = auVar164._0_4_;
              fVar233 = 1.0 - fVar238;
              auVar195._0_4_ = local_800._0_4_ * fVar238;
              auVar195._4_4_ = local_800._4_4_ * fVar238;
              auVar195._8_4_ = local_800._8_4_ * fVar238;
              auVar195._12_4_ = local_800._12_4_ * fVar238;
              local_780._0_16_ = ZEXT416((uint)fVar233);
              auVar209._4_4_ = fVar233;
              auVar209._0_4_ = fVar233;
              auVar209._8_4_ = fVar233;
              auVar209._12_4_ = fVar233;
              auVar75 = vfmadd231ps_fma(auVar195,auVar209,local_7c0._0_16_);
              auVar216._0_4_ = local_7e0._0_4_ * fVar238;
              auVar216._4_4_ = local_7e0._4_4_ * fVar238;
              auVar216._8_4_ = local_7e0._8_4_ * fVar238;
              auVar216._12_4_ = local_7e0._12_4_ * fVar238;
              auVar73 = vfmadd231ps_fma(auVar216,auVar209,local_800._0_16_);
              auVar221._0_4_ = fVar238 * (float)local_820._0_4_;
              auVar221._4_4_ = fVar238 * (float)local_820._4_4_;
              auVar221._8_4_ = fVar238 * fStack_818;
              auVar221._12_4_ = fVar238 * fStack_814;
              auVar77 = vfmadd231ps_fma(auVar221,auVar209,local_7e0._0_16_);
              auVar229._0_4_ = fVar238 * auVar73._0_4_;
              auVar229._4_4_ = fVar238 * auVar73._4_4_;
              auVar229._8_4_ = fVar238 * auVar73._8_4_;
              auVar229._12_4_ = fVar238 * auVar73._12_4_;
              auVar75 = vfmadd231ps_fma(auVar229,auVar209,auVar75);
              auVar196._0_4_ = fVar238 * auVar77._0_4_;
              auVar196._4_4_ = fVar238 * auVar77._4_4_;
              auVar196._8_4_ = fVar238 * auVar77._8_4_;
              auVar196._12_4_ = fVar238 * auVar77._12_4_;
              auVar73 = vfmadd231ps_fma(auVar196,auVar209,auVar73);
              auVar217._0_4_ = fVar238 * auVar73._0_4_;
              auVar217._4_4_ = fVar238 * auVar73._4_4_;
              auVar217._8_4_ = fVar238 * auVar73._8_4_;
              auVar217._12_4_ = fVar238 * auVar73._12_4_;
              auVar77 = vfmadd231ps_fma(auVar217,auVar75,auVar209);
              auVar75 = vsubps_avx(auVar73,auVar75);
              auVar28._8_4_ = 0x40400000;
              auVar28._0_8_ = 0x4040000040400000;
              auVar28._12_4_ = 0x40400000;
              auVar73 = vmulps_avx512vl(auVar75,auVar28);
              local_760._0_16_ = auVar77;
              auVar75 = vsubps_avx(auVar76,auVar77);
              local_9a0._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_8e0._0_16_ = auVar75;
              if (auVar75._0_4_ < 0.0) {
                auVar219._0_4_ = sqrtf(auVar75._0_4_);
                auVar219._4_60_ = extraout_var_00;
                auVar75 = auVar219._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
              }
              local_850 = vdpps_avx(auVar73,auVar73,0x7f);
              fVar233 = local_850._0_4_;
              auVar197._4_12_ = ZEXT812(0) << 0x20;
              auVar197._0_4_ = fVar233;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              fVar145 = auVar76._0_4_;
              local_960 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_850,auVar29);
              auVar76 = vfnmadd213ss_fma(local_960,local_850,ZEXT416(0x40000000));
              local_860._0_4_ = auVar76._0_4_;
              local_900._0_4_ = auVar75._0_4_;
              if (fVar233 < auVar77._0_4_) {
                auVar244._0_4_ = sqrtf(fVar233);
                auVar244._4_60_ = extraout_var_01;
                auVar75 = ZEXT416((uint)local_900._0_4_);
                auVar76 = auVar244._0_16_;
              }
              else {
                auVar76 = vsqrtss_avx512f(local_850,local_850);
              }
              fVar233 = fVar145 * 1.5 + fVar233 * -0.5 * fVar145 * fVar145 * fVar145;
              auVar150._0_4_ = auVar73._0_4_ * fVar233;
              auVar150._4_4_ = auVar73._4_4_ * fVar233;
              auVar150._8_4_ = auVar73._8_4_ * fVar233;
              auVar150._12_4_ = auVar73._12_4_ * fVar233;
              auVar77 = vdpps_avx(local_9a0._0_16_,auVar150,0x7f);
              auVar74 = vaddss_avx512f(auVar75,ZEXT416(0x3f800000));
              auVar151._0_4_ = auVar77._0_4_ * auVar77._0_4_;
              auVar151._4_4_ = auVar77._4_4_ * auVar77._4_4_;
              auVar151._8_4_ = auVar77._8_4_ * auVar77._8_4_;
              auVar151._12_4_ = auVar77._12_4_ * auVar77._12_4_;
              auVar80 = vsubps_avx(local_8e0._0_16_,auVar151);
              fVar145 = auVar80._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar145;
              auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              fVar234 = auVar78._0_4_;
              local_870._0_4_ = fVar145 * -0.5;
              uVar70 = fVar145 == 0.0;
              uVar68 = fVar145 < 0.0;
              if ((bool)uVar68) {
                local_880 = fVar233;
                fStack_87c = fVar233;
                fStack_878 = fVar233;
                fStack_874 = fVar233;
                fVar145 = sqrtf(fVar145);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416((uint)local_900._0_4_);
                auVar74 = ZEXT416(auVar74._0_4_);
                fVar233 = local_880;
                fVar206 = fStack_87c;
                fVar235 = fStack_878;
                fVar242 = fStack_874;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                fVar145 = auVar80._0_4_;
                fVar206 = fVar233;
                fVar235 = fVar233;
                fVar242 = fVar233;
              }
              auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar246 = ZEXT3264(auVar96);
              auVar244 = ZEXT3264(local_920);
              auVar245 = ZEXT3264(local_940);
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar164._0_16_,
                                        local_780._0_16_);
              fVar166 = auVar80._0_4_ * 6.0;
              fVar165 = fVar238 * 6.0;
              auVar198._0_4_ = fVar165 * (float)local_820._0_4_;
              auVar198._4_4_ = fVar165 * (float)local_820._4_4_;
              auVar198._8_4_ = fVar165 * fStack_818;
              auVar198._12_4_ = fVar165 * fStack_814;
              auVar174._4_4_ = fVar166;
              auVar174._0_4_ = fVar166;
              auVar174._8_4_ = fVar166;
              auVar174._12_4_ = fVar166;
              auVar80 = vfmadd132ps_fma(auVar174,auVar198,local_7e0._0_16_);
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,
                                        auVar164._0_16_);
              fVar166 = auVar78._0_4_ * 6.0;
              auVar199._4_4_ = fVar166;
              auVar199._0_4_ = fVar166;
              auVar199._8_4_ = fVar166;
              auVar199._12_4_ = fVar166;
              auVar80 = vfmadd132ps_fma(auVar199,auVar80,local_800._0_16_);
              fVar166 = local_780._0_4_ * 6.0;
              auVar175._4_4_ = fVar166;
              auVar175._0_4_ = fVar166;
              auVar175._8_4_ = fVar166;
              auVar175._12_4_ = fVar166;
              auVar80 = vfmadd132ps_fma(auVar175,auVar80,local_7c0._0_16_);
              auVar200._0_4_ = auVar80._0_4_ * (float)local_850._0_4_;
              auVar200._4_4_ = auVar80._4_4_ * (float)local_850._0_4_;
              auVar200._8_4_ = auVar80._8_4_ * (float)local_850._0_4_;
              auVar200._12_4_ = auVar80._12_4_ * (float)local_850._0_4_;
              auVar80 = vdpps_avx(auVar73,auVar80,0x7f);
              fVar166 = auVar80._0_4_;
              auVar176._0_4_ = auVar73._0_4_ * fVar166;
              auVar176._4_4_ = auVar73._4_4_ * fVar166;
              auVar176._8_4_ = auVar73._8_4_ * fVar166;
              auVar176._12_4_ = auVar73._12_4_ * fVar166;
              auVar80 = vsubps_avx(auVar200,auVar176);
              fVar166 = (float)local_860._0_4_ * (float)local_960._0_4_;
              auVar78 = vmaxss_avx(ZEXT416((uint)fVar224),
                                   ZEXT416((uint)(fVar231 * fVar232 * 1.9073486e-06)));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(auVar73,auVar30);
              auVar201._0_4_ = fVar233 * auVar80._0_4_ * fVar166;
              auVar201._4_4_ = fVar206 * auVar80._4_4_ * fVar166;
              auVar201._8_4_ = fVar235 * auVar80._8_4_ * fVar166;
              auVar201._12_4_ = fVar242 * auVar80._12_4_ * fVar166;
              auVar80 = vdpps_avx(auVar79,auVar150,0x7f);
              auVar81 = vdivss_avx512f(ZEXT416((uint)fVar224),auVar76);
              auVar76 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar224),auVar78);
              auVar75 = vdpps_avx(local_9a0._0_16_,auVar201,0x7f);
              vfmadd213ss_avx512f(auVar74,auVar81,auVar76);
              fVar233 = auVar80._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_950,auVar150,0x7f);
              auVar76 = vdpps_avx(local_9a0._0_16_,auVar79,0x7f);
              fVar234 = fVar234 * (float)local_870._0_4_ * fVar234 * fVar234 + fVar234 * 1.5;
              auVar80 = vdpps_avx(local_9a0._0_16_,local_950,0x7f);
              auVar74 = vfnmadd231ss_avx512f(auVar76,auVar77,ZEXT416((uint)fVar233));
              auVar79 = vfnmadd231ss_avx512f(auVar80,auVar77,auVar75);
              auVar76 = vpermilps_avx(local_760._0_16_,0xff);
              fVar145 = fVar145 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar73,auVar73,0xff);
              auVar80 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar234),auVar76);
              fVar234 = auVar79._0_4_ * fVar234;
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar80._0_4_)),
                                        ZEXT416((uint)fVar233),ZEXT416((uint)fVar234));
              fVar206 = auVar74._0_4_;
              auVar230._0_4_ = fVar234 / fVar206;
              auVar230._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar210._0_4_ = auVar80._0_4_ / fVar206;
              auVar210._4_12_ = auVar80._4_12_;
              auVar80 = vmulss_avx512f(auVar77,auVar230);
              auVar74 = vmulss_avx512f(auVar77,auVar210);
              fVar238 = fVar238 - (auVar80._0_4_ - fVar145 * (auVar75._0_4_ / fVar206));
              auVar164 = ZEXT464((uint)fVar238);
              fVar231 = fVar231 - (fVar145 * (fVar233 / fVar206) - auVar74._0_4_);
              auVar218._8_4_ = 0x7fffffff;
              auVar218._0_8_ = 0x7fffffff7fffffff;
              auVar218._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(auVar77,auVar218);
              auVar75 = vucomiss_avx512f(auVar75);
              in_ZMM31 = ZEXT1664(auVar75);
              bVar69 = true;
              if ((bool)uVar68 || (bool)uVar70) {
LAB_01df1b62:
                auVar219 = ZEXT3264(local_9c0);
              }
              else {
                auVar75 = vaddss_avx512f(auVar78,auVar75);
                auVar77 = vfmadd231ss_fma(auVar75,local_8a0,ZEXT416(0x36000000));
                auVar75 = vandps_avx(ZEXT416((uint)fVar145),auVar218);
                if (auVar77._0_4_ <= auVar75._0_4_) goto LAB_01df1b62;
                fVar231 = fVar231 + (float)local_890._0_4_;
                auVar219 = ZEXT3264(local_9c0);
                if ((((fVar231 < fVar144) ||
                     (fVar233 = *(float *)(ray + k * 4 + 0x200), fVar233 < fVar231)) ||
                    (fVar238 < 0.0)) || (1.0 < fVar238)) {
LAB_01df1b5d:
                  bVar69 = false;
                  bVar61 = 0;
                }
                else {
                  auVar51._12_4_ = 0;
                  auVar51._0_12_ = ZEXT812(0);
                  auVar75 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)local_8e0._0_4_));
                  fVar145 = auVar75._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01df1b5d;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar61 = true;
                  }
                  else {
                    fVar145 = fVar145 * 1.5 +
                              (float)local_8e0._0_4_ * -0.5 * fVar145 * fVar145 * fVar145;
                    auVar177._0_4_ = local_9a0._0_4_ * fVar145;
                    auVar177._4_4_ = local_9a0._4_4_ * fVar145;
                    auVar177._8_4_ = local_9a0._8_4_ * fVar145;
                    auVar177._12_4_ = local_9a0._12_4_ * fVar145;
                    auVar77 = vfmadd213ps_fma(auVar76,auVar177,auVar73);
                    auVar75 = vshufps_avx(auVar177,auVar177,0xc9);
                    auVar76 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar178._0_4_ = auVar177._0_4_ * auVar76._0_4_;
                    auVar178._4_4_ = auVar177._4_4_ * auVar76._4_4_;
                    auVar178._8_4_ = auVar177._8_4_ * auVar76._8_4_;
                    auVar178._12_4_ = auVar177._12_4_ * auVar76._12_4_;
                    auVar73 = vfmsub231ps_fma(auVar178,auVar73,auVar75);
                    auVar75 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                    auVar152._0_4_ = auVar77._0_4_ * auVar73._0_4_;
                    auVar152._4_4_ = auVar77._4_4_ * auVar73._4_4_;
                    auVar152._8_4_ = auVar77._8_4_ * auVar73._8_4_;
                    auVar152._12_4_ = auVar77._12_4_ * auVar73._12_4_;
                    auVar75 = vfmsub231ps_fma(auVar152,auVar75,auVar76);
                    auVar76 = ZEXT416((uint)fVar238);
                    local_340 = vbroadcastss_avx512f(auVar76);
                    auVar212 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar212 = vpermps_avx512f(auVar212,ZEXT1664(auVar75));
                    auVar136 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar136,ZEXT1664(auVar75));
                    local_380 = vbroadcastss_avx512f(auVar75);
                    local_400[0] = (RTCHitN)auVar212[0];
                    local_400[1] = (RTCHitN)auVar212[1];
                    local_400[2] = (RTCHitN)auVar212[2];
                    local_400[3] = (RTCHitN)auVar212[3];
                    local_400[4] = (RTCHitN)auVar212[4];
                    local_400[5] = (RTCHitN)auVar212[5];
                    local_400[6] = (RTCHitN)auVar212[6];
                    local_400[7] = (RTCHitN)auVar212[7];
                    local_400[8] = (RTCHitN)auVar212[8];
                    local_400[9] = (RTCHitN)auVar212[9];
                    local_400[10] = (RTCHitN)auVar212[10];
                    local_400[0xb] = (RTCHitN)auVar212[0xb];
                    local_400[0xc] = (RTCHitN)auVar212[0xc];
                    local_400[0xd] = (RTCHitN)auVar212[0xd];
                    local_400[0xe] = (RTCHitN)auVar212[0xe];
                    local_400[0xf] = (RTCHitN)auVar212[0xf];
                    local_400[0x10] = (RTCHitN)auVar212[0x10];
                    local_400[0x11] = (RTCHitN)auVar212[0x11];
                    local_400[0x12] = (RTCHitN)auVar212[0x12];
                    local_400[0x13] = (RTCHitN)auVar212[0x13];
                    local_400[0x14] = (RTCHitN)auVar212[0x14];
                    local_400[0x15] = (RTCHitN)auVar212[0x15];
                    local_400[0x16] = (RTCHitN)auVar212[0x16];
                    local_400[0x17] = (RTCHitN)auVar212[0x17];
                    local_400[0x18] = (RTCHitN)auVar212[0x18];
                    local_400[0x19] = (RTCHitN)auVar212[0x19];
                    local_400[0x1a] = (RTCHitN)auVar212[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar212[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar212[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar212[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar212[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar212[0x1f];
                    local_400[0x20] = (RTCHitN)auVar212[0x20];
                    local_400[0x21] = (RTCHitN)auVar212[0x21];
                    local_400[0x22] = (RTCHitN)auVar212[0x22];
                    local_400[0x23] = (RTCHitN)auVar212[0x23];
                    local_400[0x24] = (RTCHitN)auVar212[0x24];
                    local_400[0x25] = (RTCHitN)auVar212[0x25];
                    local_400[0x26] = (RTCHitN)auVar212[0x26];
                    local_400[0x27] = (RTCHitN)auVar212[0x27];
                    local_400[0x28] = (RTCHitN)auVar212[0x28];
                    local_400[0x29] = (RTCHitN)auVar212[0x29];
                    local_400[0x2a] = (RTCHitN)auVar212[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar212[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar212[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar212[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar212[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar212[0x2f];
                    local_400[0x30] = (RTCHitN)auVar212[0x30];
                    local_400[0x31] = (RTCHitN)auVar212[0x31];
                    local_400[0x32] = (RTCHitN)auVar212[0x32];
                    local_400[0x33] = (RTCHitN)auVar212[0x33];
                    local_400[0x34] = (RTCHitN)auVar212[0x34];
                    local_400[0x35] = (RTCHitN)auVar212[0x35];
                    local_400[0x36] = (RTCHitN)auVar212[0x36];
                    local_400[0x37] = (RTCHitN)auVar212[0x37];
                    local_400[0x38] = (RTCHitN)auVar212[0x38];
                    local_400[0x39] = (RTCHitN)auVar212[0x39];
                    local_400[0x3a] = (RTCHitN)auVar212[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar212[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar212[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar212[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar212[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar212[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_440._0_8_;
                    uStack_2b8 = local_440._8_8_;
                    uStack_2b0 = local_440._16_8_;
                    uStack_2a8 = local_440._24_8_;
                    uStack_2a0 = local_440._32_8_;
                    uStack_298 = local_440._40_8_;
                    uStack_290 = local_440._48_8_;
                    uStack_288 = local_440._56_8_;
                    auVar212 = vmovdqa64_avx512f(local_480);
                    local_280 = vmovdqa64_avx512f(auVar212);
                    vpcmpeqd_avx2(auVar212._0_32_,auVar212._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar231;
                    local_700 = local_4c0;
                    local_9f0.valid = (int *)local_700;
                    local_9f0.geometryUserPtr = pGVar3->userPtr;
                    local_9f0.context = context->user;
                    local_9f0.hit = local_400;
                    local_9f0.N = 0x10;
                    local_9f0.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_9f0);
                      auVar164 = ZEXT1664(auVar76);
                      auVar245 = ZEXT3264(local_940);
                      auVar244 = ZEXT3264(local_920);
                      auVar219 = ZEXT3264(local_9c0);
                      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar246 = ZEXT3264(auVar96);
                    }
                    auVar212 = vmovdqa64_avx512f(local_700);
                    uVar21 = vptestmd_avx512f(auVar212,auVar212);
                    if ((short)uVar21 == 0) {
                      bVar61 = false;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&local_9f0);
                        auVar164 = ZEXT1664(auVar76);
                        auVar245 = ZEXT3264(local_940);
                        auVar244 = ZEXT3264(local_920);
                        auVar219 = ZEXT3264(local_9c0);
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar246 = ZEXT3264(auVar96);
                      }
                      auVar212 = vmovdqa64_avx512f(local_700);
                      uVar60 = vptestmd_avx512f(auVar212,auVar212);
                      auVar212 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar69 = (bool)((byte)uVar60 & 1);
                      auVar136._0_4_ =
                           (uint)bVar69 * auVar212._0_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x200);
                      bVar69 = (bool)((byte)(uVar60 >> 1) & 1);
                      auVar136._4_4_ =
                           (uint)bVar69 * auVar212._4_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x204);
                      bVar69 = (bool)((byte)(uVar60 >> 2) & 1);
                      auVar136._8_4_ =
                           (uint)bVar69 * auVar212._8_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x208);
                      bVar69 = (bool)((byte)(uVar60 >> 3) & 1);
                      auVar136._12_4_ =
                           (uint)bVar69 * auVar212._12_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x20c);
                      bVar69 = (bool)((byte)(uVar60 >> 4) & 1);
                      auVar136._16_4_ =
                           (uint)bVar69 * auVar212._16_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x210);
                      bVar69 = (bool)((byte)(uVar60 >> 5) & 1);
                      auVar136._20_4_ =
                           (uint)bVar69 * auVar212._20_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x214);
                      bVar69 = (bool)((byte)(uVar60 >> 6) & 1);
                      auVar136._24_4_ =
                           (uint)bVar69 * auVar212._24_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x218);
                      bVar69 = (bool)((byte)(uVar60 >> 7) & 1);
                      auVar136._28_4_ =
                           (uint)bVar69 * auVar212._28_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x21c);
                      bVar69 = (bool)((byte)(uVar60 >> 8) & 1);
                      auVar136._32_4_ =
                           (uint)bVar69 * auVar212._32_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x220);
                      bVar69 = (bool)((byte)(uVar60 >> 9) & 1);
                      auVar136._36_4_ =
                           (uint)bVar69 * auVar212._36_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x224);
                      bVar69 = (bool)((byte)(uVar60 >> 10) & 1);
                      auVar136._40_4_ =
                           (uint)bVar69 * auVar212._40_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x228);
                      bVar69 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      auVar136._44_4_ =
                           (uint)bVar69 * auVar212._44_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x22c);
                      bVar69 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      auVar136._48_4_ =
                           (uint)bVar69 * auVar212._48_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x230);
                      bVar69 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      auVar136._52_4_ =
                           (uint)bVar69 * auVar212._52_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x234);
                      bVar69 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      auVar136._56_4_ =
                           (uint)bVar69 * auVar212._56_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x238);
                      bVar69 = SUB81(uVar60 >> 0xf,0);
                      auVar136._60_4_ =
                           (uint)bVar69 * auVar212._60_4_ |
                           (uint)!bVar69 * *(int *)(local_9f0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9f0.ray + 0x200) = auVar136;
                      bVar61 = (short)uVar60 != 0;
                    }
                    if ((bool)bVar61 == false) {
                      *(float *)(ray + k * 4 + 0x200) = fVar233;
                    }
                  }
                  bVar69 = false;
                }
              }
              if (!bVar69) goto LAB_01df1fb2;
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
            bVar61 = 0;
LAB_01df1fb2:
            bVar65 = bVar65 | bVar61 & 1;
            auVar53._4_4_ = fStack_67c;
            auVar53._0_4_ = local_680;
            auVar53._8_4_ = fStack_678;
            auVar53._12_4_ = fStack_674;
            auVar53._16_4_ = fStack_670;
            auVar53._20_4_ = fStack_66c;
            auVar53._24_4_ = fStack_668;
            auVar53._28_4_ = fStack_664;
            uVar223 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar39._4_4_ = uVar223;
            auVar39._0_4_ = uVar223;
            auVar39._8_4_ = uVar223;
            auVar39._12_4_ = uVar223;
            auVar39._16_4_ = uVar223;
            auVar39._20_4_ = uVar223;
            auVar39._24_4_ = uVar223;
            auVar39._28_4_ = uVar223;
            uVar21 = vcmpps_avx512vl(auVar53,auVar39,2);
            bVar62 = bVar66 & bVar62 & (byte)uVar21;
          } while (bVar62 != 0);
        }
        uVar23 = vpcmpd_avx512vl(local_620,_local_6a0,1);
        uVar22 = vpcmpd_avx512vl(local_620,local_5a0,1);
        auVar183._0_4_ = (float)local_720._0_4_ + (float)local_500._0_4_;
        auVar183._4_4_ = (float)local_720._4_4_ + (float)local_500._4_4_;
        auVar183._8_4_ = fStack_718 + fStack_4f8;
        auVar183._12_4_ = fStack_714 + fStack_4f4;
        auVar183._16_4_ = fStack_710 + fStack_4f0;
        auVar183._20_4_ = fStack_70c + fStack_4ec;
        auVar183._24_4_ = fStack_708 + fStack_4e8;
        auVar183._28_4_ = fStack_704 + fStack_4e4;
        uVar223 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar205._4_4_ = uVar223;
        auVar205._0_4_ = uVar223;
        auVar205._8_4_ = uVar223;
        auVar205._12_4_ = uVar223;
        auVar205._16_4_ = uVar223;
        auVar205._20_4_ = uVar223;
        auVar205._24_4_ = uVar223;
        auVar205._28_4_ = uVar223;
        uVar21 = vcmpps_avx512vl(auVar183,auVar205,2);
        bVar57 = bVar57 & (byte)uVar22 & (byte)uVar21;
        auVar211._0_4_ = (float)local_720._0_4_ + local_5e0._0_4_;
        auVar211._4_4_ = (float)local_720._4_4_ + local_5e0._4_4_;
        auVar211._8_4_ = fStack_718 + local_5e0._8_4_;
        auVar211._12_4_ = fStack_714 + local_5e0._12_4_;
        auVar211._16_4_ = fStack_710 + local_5e0._16_4_;
        auVar211._20_4_ = fStack_70c + local_5e0._20_4_;
        auVar211._24_4_ = fStack_708 + local_5e0._24_4_;
        auVar211._28_4_ = fStack_704 + local_5e0._28_4_;
        uVar21 = vcmpps_avx512vl(auVar211,auVar205,2);
        bVar58 = bVar58 & (byte)uVar23 & (byte)uVar21 | bVar57;
        if (bVar58 != 0) {
          local_1a0[uVar56 * 0x60] = bVar58;
          auVar134._0_4_ =
               (uint)(bVar57 & 1) * local_500._0_4_ |
               (uint)!(bool)(bVar57 & 1) * (int)local_5e0._0_4_;
          bVar69 = (bool)(bVar57 >> 1 & 1);
          auVar134._4_4_ = (uint)bVar69 * local_500._4_4_ | (uint)!bVar69 * (int)local_5e0._4_4_;
          bVar69 = (bool)(bVar57 >> 2 & 1);
          auVar134._8_4_ = (uint)bVar69 * (int)fStack_4f8 | (uint)!bVar69 * (int)local_5e0._8_4_;
          bVar69 = (bool)(bVar57 >> 3 & 1);
          auVar134._12_4_ = (uint)bVar69 * (int)fStack_4f4 | (uint)!bVar69 * (int)local_5e0._12_4_;
          bVar69 = (bool)(bVar57 >> 4 & 1);
          auVar134._16_4_ = (uint)bVar69 * (int)fStack_4f0 | (uint)!bVar69 * (int)local_5e0._16_4_;
          bVar69 = (bool)(bVar57 >> 5 & 1);
          auVar134._20_4_ = (uint)bVar69 * (int)fStack_4ec | (uint)!bVar69 * (int)local_5e0._20_4_;
          auVar134._24_4_ =
               (uint)(bVar57 >> 6) * (int)fStack_4e8 |
               (uint)!(bool)(bVar57 >> 6) * (int)local_5e0._24_4_;
          auVar134._28_4_ = local_5e0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar56 * 0x60) = auVar134;
          uVar21 = vmovlps_avx(local_8b0);
          *(undefined8 *)(local_160 + uVar56 * 0x18) = uVar21;
          local_158[uVar56 * 0x18] = iVar2 + 1;
          uVar56 = (ulong)((int)uVar56 + 1);
        }
        auVar212 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar164 = ZEXT3264(local_840);
      }
    }
    do {
      if ((int)uVar56 == 0) {
        if (bVar65 != 0) {
          return bVar71;
        }
        uVar223 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar41._4_4_ = uVar223;
        auVar41._0_4_ = uVar223;
        auVar41._8_4_ = uVar223;
        auVar41._12_4_ = uVar223;
        auVar41._16_4_ = uVar223;
        auVar41._20_4_ = uVar223;
        auVar41._24_4_ = uVar223;
        auVar41._28_4_ = uVar223;
        uVar21 = vcmpps_avx512vl(local_580,auVar41,2);
        uVar63 = (uint)uVar64 & (uint)uVar21;
        uVar64 = (ulong)uVar63;
        bVar71 = uVar63 != 0;
        if (!bVar71) {
          return bVar71;
        }
        goto LAB_01def91a;
      }
      uVar60 = (ulong)((int)uVar56 - 1);
      lVar67 = uVar60 * 0x60;
      auVar96 = *(undefined1 (*) [32])(auStack_180 + lVar67);
      auVar184._0_4_ = auVar96._0_4_ + (float)local_720._0_4_;
      auVar184._4_4_ = auVar96._4_4_ + (float)local_720._4_4_;
      auVar184._8_4_ = auVar96._8_4_ + fStack_718;
      auVar184._12_4_ = auVar96._12_4_ + fStack_714;
      auVar184._16_4_ = auVar96._16_4_ + fStack_710;
      auVar184._20_4_ = auVar96._20_4_ + fStack_70c;
      auVar184._24_4_ = auVar96._24_4_ + fStack_708;
      auVar184._28_4_ = auVar96._28_4_ + fStack_704;
      uVar223 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar40._4_4_ = uVar223;
      auVar40._0_4_ = uVar223;
      auVar40._8_4_ = uVar223;
      auVar40._12_4_ = uVar223;
      auVar40._16_4_ = uVar223;
      auVar40._20_4_ = uVar223;
      auVar40._24_4_ = uVar223;
      auVar40._28_4_ = uVar223;
      uVar21 = vcmpps_avx512vl(auVar184,auVar40,2);
      uVar72 = (uint)uVar21 & (uint)local_1a0[lVar67];
      bVar58 = (byte)uVar72;
      if (uVar72 != 0) {
        auVar185._8_4_ = 0x7f800000;
        auVar185._0_8_ = 0x7f8000007f800000;
        auVar185._12_4_ = 0x7f800000;
        auVar185._16_4_ = 0x7f800000;
        auVar185._20_4_ = 0x7f800000;
        auVar185._24_4_ = 0x7f800000;
        auVar185._28_4_ = 0x7f800000;
        auVar82 = vblendmps_avx512vl(auVar185,auVar96);
        auVar135._0_4_ =
             (uint)(bVar58 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)auVar96._0_4_;
        bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * (int)auVar96._4_4_;
        bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * (int)auVar96._8_4_;
        bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * (int)auVar96._12_4_;
        bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar69 * auVar82._16_4_ | (uint)!bVar69 * (int)auVar96._16_4_;
        bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar69 * auVar82._20_4_ | (uint)!bVar69 * (int)auVar96._20_4_;
        bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar69 * auVar82._24_4_ | (uint)!bVar69 * (int)auVar96._24_4_;
        auVar135._28_4_ =
             (uVar72 >> 7) * auVar82._28_4_ | (uint)!SUB41(uVar72 >> 7,0) * (int)auVar96._28_4_;
        auVar96 = vshufps_avx(auVar135,auVar135,0xb1);
        auVar96 = vminps_avx(auVar135,auVar96);
        auVar82 = vshufpd_avx(auVar96,auVar96,5);
        auVar96 = vminps_avx(auVar96,auVar82);
        auVar82 = vpermpd_avx2(auVar96,0x4e);
        auVar96 = vminps_avx(auVar96,auVar82);
        uVar21 = vcmpps_avx512vl(auVar135,auVar96,0);
        bVar62 = (byte)uVar21 & bVar58;
        if (bVar62 != 0) {
          uVar72 = (uint)bVar62;
        }
        fVar224 = local_160[uVar60 * 0x18 + 1];
        uVar137 = 0;
        for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
          uVar137 = uVar137 + 1;
        }
        iVar2 = local_158[uVar60 * 0x18];
        bVar62 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar58;
        local_1a0[lVar67] = bVar62;
        auVar164 = ZEXT3264(local_840);
        uVar59 = uVar60;
        if (bVar62 != 0) {
          uVar59 = uVar56;
        }
        fVar231 = local_160[uVar60 * 0x18];
        auVar186._4_4_ = fVar231;
        auVar186._0_4_ = fVar231;
        auVar186._8_4_ = fVar231;
        auVar186._12_4_ = fVar231;
        auVar186._16_4_ = fVar231;
        auVar186._20_4_ = fVar231;
        auVar186._24_4_ = fVar231;
        auVar186._28_4_ = fVar231;
        fVar224 = fVar224 - fVar231;
        auVar163._4_4_ = fVar224;
        auVar163._0_4_ = fVar224;
        auVar163._8_4_ = fVar224;
        auVar163._12_4_ = fVar224;
        auVar163._16_4_ = fVar224;
        auVar163._20_4_ = fVar224;
        auVar163._24_4_ = fVar224;
        auVar163._28_4_ = fVar224;
        auVar75 = vfmadd132ps_fma(auVar163,auVar186,_DAT_02020f20);
        auVar96 = ZEXT1632(auVar75);
        local_400[0] = (RTCHitN)auVar96[0];
        local_400[1] = (RTCHitN)auVar96[1];
        local_400[2] = (RTCHitN)auVar96[2];
        local_400[3] = (RTCHitN)auVar96[3];
        local_400[4] = (RTCHitN)auVar96[4];
        local_400[5] = (RTCHitN)auVar96[5];
        local_400[6] = (RTCHitN)auVar96[6];
        local_400[7] = (RTCHitN)auVar96[7];
        local_400[8] = (RTCHitN)auVar96[8];
        local_400[9] = (RTCHitN)auVar96[9];
        local_400[10] = (RTCHitN)auVar96[10];
        local_400[0xb] = (RTCHitN)auVar96[0xb];
        local_400[0xc] = (RTCHitN)auVar96[0xc];
        local_400[0xd] = (RTCHitN)auVar96[0xd];
        local_400[0xe] = (RTCHitN)auVar96[0xe];
        local_400[0xf] = (RTCHitN)auVar96[0xf];
        local_400[0x10] = (RTCHitN)auVar96[0x10];
        local_400[0x11] = (RTCHitN)auVar96[0x11];
        local_400[0x12] = (RTCHitN)auVar96[0x12];
        local_400[0x13] = (RTCHitN)auVar96[0x13];
        local_400[0x14] = (RTCHitN)auVar96[0x14];
        local_400[0x15] = (RTCHitN)auVar96[0x15];
        local_400[0x16] = (RTCHitN)auVar96[0x16];
        local_400[0x17] = (RTCHitN)auVar96[0x17];
        local_400[0x18] = (RTCHitN)auVar96[0x18];
        local_400[0x19] = (RTCHitN)auVar96[0x19];
        local_400[0x1a] = (RTCHitN)auVar96[0x1a];
        local_400[0x1b] = (RTCHitN)auVar96[0x1b];
        local_400[0x1c] = (RTCHitN)auVar96[0x1c];
        local_400[0x1d] = (RTCHitN)auVar96[0x1d];
        local_400[0x1e] = (RTCHitN)auVar96[0x1e];
        local_400[0x1f] = (RTCHitN)auVar96[0x1f];
        local_8b0._8_8_ = 0;
        local_8b0._0_8_ = *(ulong *)(local_400 + (ulong)uVar137 * 4);
        uVar60 = uVar59;
      }
      uVar56 = uVar60;
    } while (bVar58 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }